

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  uint uVar58;
  byte bVar59;
  byte bVar60;
  ulong uVar61;
  undefined8 in_R11;
  byte bVar62;
  ulong uVar63;
  bool bVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar119;
  uint uVar120;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar122;
  uint uVar123;
  uint uVar124;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  uint uVar121;
  uint uVar125;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined4 uVar126;
  vint4 bi_2;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar130 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar199;
  float fVar200;
  vint4 ai_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar205;
  vint4 bi;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  vint4 ai_1;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [64];
  float fVar223;
  vint4 ai;
  undefined1 auVar221 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar222 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [64];
  float fVar244;
  undefined1 auVar237 [16];
  float fVar234;
  float fVar242;
  float fVar243;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [64];
  undefined1 auVar245 [28];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [32];
  float s;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_920;
  int local_904;
  undefined1 local_900 [32];
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  uint local_7a8;
  uint local_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined8 local_640;
  undefined4 local_638;
  float local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  uint local_624;
  uint local_620;
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  ulong local_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar241 [64];
  
  uVar63 = (ulong)(byte)prim[1];
  fVar205 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar69 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar161._0_4_ = fVar205 * (ray->dir).field_0.m128[0];
  auVar161._4_4_ = fVar205 * (ray->dir).field_0.m128[1];
  auVar161._8_4_ = fVar205 * (ray->dir).field_0.m128[2];
  auVar161._12_4_ = fVar205 * (ray->dir).field_0.m128[3];
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar212._0_4_ = fVar205 * auVar69._0_4_;
  auVar212._4_4_ = fVar205 * auVar69._4_4_;
  auVar212._8_4_ = fVar205 * auVar69._8_4_;
  auVar212._12_4_ = fVar205 * auVar69._12_4_;
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xc + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xd + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x12 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x13 + 6)));
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x14 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar252._4_4_ = auVar161._0_4_;
  auVar252._0_4_ = auVar161._0_4_;
  auVar252._8_4_ = auVar161._0_4_;
  auVar252._12_4_ = auVar161._0_4_;
  auVar13 = vshufps_avx(auVar161,auVar161,0x55);
  auVar75 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar205 = auVar75._0_4_;
  auVar206._0_4_ = fVar205 * auVar70._0_4_;
  fVar178 = auVar75._4_4_;
  auVar206._4_4_ = fVar178 * auVar70._4_4_;
  fVar199 = auVar75._8_4_;
  auVar206._8_4_ = fVar199 * auVar70._8_4_;
  fVar200 = auVar75._12_4_;
  auVar206._12_4_ = fVar200 * auVar70._12_4_;
  auVar143._0_4_ = auVar73._0_4_ * fVar205;
  auVar143._4_4_ = auVar73._4_4_ * fVar178;
  auVar143._8_4_ = auVar73._8_4_ * fVar199;
  auVar143._12_4_ = auVar73._12_4_ * fVar200;
  auVar127._0_4_ = auVar12._0_4_ * fVar205;
  auVar127._4_4_ = auVar12._4_4_ * fVar178;
  auVar127._8_4_ = auVar12._8_4_ * fVar199;
  auVar127._12_4_ = auVar12._12_4_ * fVar200;
  auVar75 = vfmadd231ps_fma(auVar206,auVar13,auVar69);
  auVar68 = vfmadd231ps_fma(auVar143,auVar13,auVar72);
  auVar13 = vfmadd231ps_fma(auVar127,auVar237,auVar13);
  auVar67 = vfmadd231ps_fma(auVar75,auVar252,auVar71);
  auVar68 = vfmadd231ps_fma(auVar68,auVar252,auVar76);
  auVar127 = vfmadd231ps_fma(auVar13,auVar74,auVar252);
  auVar253._4_4_ = auVar212._0_4_;
  auVar253._0_4_ = auVar212._0_4_;
  auVar253._8_4_ = auVar212._0_4_;
  auVar253._12_4_ = auVar212._0_4_;
  auVar13 = vshufps_avx(auVar212,auVar212,0x55);
  auVar75 = vshufps_avx(auVar212,auVar212,0xaa);
  fVar205 = auVar75._0_4_;
  auVar213._0_4_ = fVar205 * auVar70._0_4_;
  fVar178 = auVar75._4_4_;
  auVar213._4_4_ = fVar178 * auVar70._4_4_;
  fVar199 = auVar75._8_4_;
  auVar213._8_4_ = fVar199 * auVar70._8_4_;
  fVar200 = auVar75._12_4_;
  auVar213._12_4_ = fVar200 * auVar70._12_4_;
  auVar179._0_4_ = auVar73._0_4_ * fVar205;
  auVar179._4_4_ = auVar73._4_4_ * fVar178;
  auVar179._8_4_ = auVar73._8_4_ * fVar199;
  auVar179._12_4_ = auVar73._12_4_ * fVar200;
  auVar162._0_4_ = auVar12._0_4_ * fVar205;
  auVar162._4_4_ = auVar12._4_4_ * fVar178;
  auVar162._8_4_ = auVar12._8_4_ * fVar199;
  auVar162._12_4_ = auVar12._12_4_ * fVar200;
  auVar69 = vfmadd231ps_fma(auVar213,auVar13,auVar69);
  auVar70 = vfmadd231ps_fma(auVar179,auVar13,auVar72);
  auVar72 = vfmadd231ps_fma(auVar162,auVar13,auVar237);
  auVar73 = vfmadd231ps_fma(auVar69,auVar253,auVar71);
  auVar237 = vfmadd231ps_fma(auVar70,auVar253,auVar76);
  auVar12 = vfmadd231ps_fma(auVar72,auVar253,auVar74);
  auVar235._8_4_ = 0x7fffffff;
  auVar235._0_8_ = 0x7fffffff7fffffff;
  auVar235._12_4_ = 0x7fffffff;
  auVar71 = vandps_avx(auVar235,auVar67);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar71,auVar227,1);
  bVar64 = (bool)((byte)uVar65 & 1);
  auVar75._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar67._0_4_;
  bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar67._4_4_;
  bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar67._8_4_;
  bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar67._12_4_;
  auVar71 = vandps_avx(auVar235,auVar68);
  uVar65 = vcmpps_avx512vl(auVar71,auVar227,1);
  bVar64 = (bool)((byte)uVar65 & 1);
  auVar67._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar68._0_4_;
  bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar68._4_4_;
  bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar68._8_4_;
  bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar68._12_4_;
  auVar71 = vandps_avx(auVar235,auVar127);
  uVar65 = vcmpps_avx512vl(auVar71,auVar227,1);
  bVar64 = (bool)((byte)uVar65 & 1);
  auVar68._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar127._0_4_;
  bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar127._4_4_;
  bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar127._8_4_;
  bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar127._12_4_;
  auVar69 = vrcp14ps_avx512vl(auVar75);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = 0x3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar75,auVar69,auVar228);
  auVar76 = vfmadd132ps_fma(auVar71,auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar67);
  auVar71 = vfnmadd213ps_fma(auVar67,auVar69,auVar228);
  auVar72 = vfmadd132ps_fma(auVar71,auVar69,auVar69);
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar69 = vfnmadd213ps_fma(auVar68,auVar70,auVar228);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar71 = vpmovsxwd_avx(auVar71);
  auVar74 = vfmadd132ps_fma(auVar69,auVar70,auVar70);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vsubps_avx(auVar71,auVar73);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar71 = vpmovsxwd_avx(auVar69);
  auVar221._0_4_ = auVar76._0_4_ * auVar70._0_4_;
  auVar221._4_4_ = auVar76._4_4_ * auVar70._4_4_;
  auVar221._8_4_ = auVar76._8_4_ * auVar70._8_4_;
  auVar221._12_4_ = auVar76._12_4_ * auVar70._12_4_;
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar69 = vsubps_avx(auVar71,auVar73);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar63 * 0xe + 6);
  auVar71 = vpmovsxwd_avx(auVar70);
  auVar207._0_4_ = auVar76._0_4_ * auVar69._0_4_;
  auVar207._4_4_ = auVar76._4_4_ * auVar69._4_4_;
  auVar207._8_4_ = auVar76._8_4_ * auVar69._8_4_;
  auVar207._12_4_ = auVar76._12_4_ * auVar69._12_4_;
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,auVar237);
  auVar214._0_4_ = auVar72._0_4_ * auVar71._0_4_;
  auVar214._4_4_ = auVar72._4_4_ * auVar71._4_4_;
  auVar214._8_4_ = auVar72._8_4_ * auVar71._8_4_;
  auVar214._12_4_ = auVar72._12_4_ * auVar71._12_4_;
  auVar70 = vpbroadcastd_avx512vl();
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar71 = vpmovsxwd_avx(auVar76);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,auVar237);
  auVar144._0_4_ = auVar72._0_4_ * auVar71._0_4_;
  auVar144._4_4_ = auVar72._4_4_ * auVar71._4_4_;
  auVar144._8_4_ = auVar72._8_4_ * auVar71._8_4_;
  auVar144._12_4_ = auVar72._12_4_ * auVar71._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 0x15 + 6);
  auVar71 = vpmovsxwd_avx(auVar72);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,auVar12);
  auVar180._0_4_ = auVar74._0_4_ * auVar71._0_4_;
  auVar180._4_4_ = auVar74._4_4_ * auVar71._4_4_;
  auVar180._8_4_ = auVar74._8_4_ * auVar71._8_4_;
  auVar180._12_4_ = auVar74._12_4_ * auVar71._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar71 = vpmovsxwd_avx(auVar73);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar71 = vsubps_avx(auVar71,auVar12);
  auVar128._0_4_ = auVar74._0_4_ * auVar71._0_4_;
  auVar128._4_4_ = auVar74._4_4_ * auVar71._4_4_;
  auVar128._8_4_ = auVar74._8_4_ * auVar71._8_4_;
  auVar128._12_4_ = auVar74._12_4_ * auVar71._12_4_;
  auVar71 = vpminsd_avx(auVar221,auVar207);
  auVar69 = vpminsd_avx(auVar214,auVar144);
  auVar71 = vmaxps_avx(auVar71,auVar69);
  auVar69 = vpminsd_avx(auVar180,auVar128);
  uVar126 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar74._4_4_ = uVar126;
  auVar74._0_4_ = uVar126;
  auVar74._8_4_ = uVar126;
  auVar74._12_4_ = uVar126;
  auVar69 = vmaxps_avx512vl(auVar69,auVar74);
  auVar71 = vmaxps_avx(auVar71,auVar69);
  auVar237._8_4_ = 0x3f7ffffa;
  auVar237._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar237._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar71,auVar237);
  auVar71 = vpmaxsd_avx(auVar221,auVar207);
  auVar69 = vpmaxsd_avx(auVar214,auVar144);
  auVar71 = vminps_avx(auVar71,auVar69);
  auVar69 = vpmaxsd_avx(auVar180,auVar128);
  fVar205 = ray->tfar;
  auVar12._4_4_ = fVar205;
  auVar12._0_4_ = fVar205;
  auVar12._8_4_ = fVar205;
  auVar12._12_4_ = fVar205;
  auVar69 = vminps_avx512vl(auVar69,auVar12);
  auVar71 = vminps_avx(auVar71,auVar69);
  auVar13._8_4_ = 0x3f800003;
  auVar13._0_8_ = 0x3f8000033f800003;
  auVar13._12_4_ = 0x3f800003;
  auVar71 = vmulps_avx512vl(auVar71,auVar13);
  uVar14 = vcmpps_avx512vl(local_3a0,auVar71,2);
  uVar16 = vpcmpgtd_avx512vl(auVar70,_DAT_01f4ad30);
  local_608 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)((byte)uVar14 & 0xf & (byte)uVar16));
  local_610 = prim;
LAB_017e9e9c:
  if (local_608 == 0) {
LAB_017ec6ed:
    return local_608 != 0;
  }
  lVar18 = 0;
  for (uVar65 = local_608; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  local_8c8 = (ulong)*(uint *)(prim + 2);
  local_8d0 = (ulong)*(uint *)(prim + lVar18 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8d0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar3[1].time_range.upper;
  auVar71 = *(undefined1 (*) [16])(lVar18 + (long)p_Var4 * uVar65);
  auVar69 = *(undefined1 (*) [16])(lVar18 + (uVar65 + 1) * (long)p_Var4);
  local_4c8 = local_608 - 1 & local_608;
  if (local_4c8 != 0) {
    uVar61 = local_4c8 - 1 & local_4c8;
    for (uVar63 = local_4c8; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar215._0_4_ = auVar71._0_4_ + auVar69._0_4_;
  auVar215._4_4_ = auVar71._4_4_ + auVar69._4_4_;
  auVar215._8_4_ = auVar71._8_4_ + auVar69._8_4_;
  auVar215._12_4_ = auVar71._12_4_ + auVar69._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar19._8_4_ = 0x3f000000;
  auVar19._0_8_ = 0x3f0000003f000000;
  auVar19._12_4_ = 0x3f000000;
  auVar70 = vmulps_avx512vl(auVar215,auVar19);
  auVar70 = vsubps_avx(auVar70,(undefined1  [16])aVar1);
  auVar70 = vdpps_avx(auVar70,(undefined1  [16])aVar2,0x7f);
  auVar76 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar73 = ZEXT816(0) << 0x40;
  auVar247 = ZEXT1664(auVar73);
  auVar236._4_12_ = ZEXT812(0) << 0x20;
  auVar236._0_4_ = auVar76._0_4_;
  auVar72 = vrcp14ss_avx512f(auVar73,auVar236);
  auVar240 = ZEXT1664(auVar72);
  auVar76 = vfnmadd213ss_fma(auVar72,auVar76,ZEXT416(0x40000000));
  fVar205 = auVar70._0_4_ * auVar72._0_4_ * auVar76._0_4_;
  local_510 = ZEXT416((uint)fVar205);
  auVar216._4_4_ = fVar205;
  auVar216._0_4_ = fVar205;
  auVar216._8_4_ = fVar205;
  auVar216._12_4_ = fVar205;
  fStack_3f0 = fVar205;
  _local_400 = auVar216;
  fStack_3ec = fVar205;
  fStack_3e8 = fVar205;
  fStack_3e4 = fVar205;
  auVar70 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar216);
  auVar70 = vblendps_avx(auVar70,auVar73,8);
  auVar71 = vsubps_avx(auVar71,auVar70);
  local_700 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar259 = ZEXT3264(local_700);
  auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + (uVar65 + 2) * (long)p_Var4),auVar70);
  local_720 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar262 = ZEXT3264(local_720);
  local_440 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar233 = ZEXT1664(auVar69);
  auVar70 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + (uVar65 + 3) * (long)p_Var4),auVar70);
  local_800 = vbroadcastss_avx512vl(auVar71);
  auVar254 = ZEXT3264(local_800);
  auVar80._8_4_ = 1;
  auVar80._0_8_ = 0x100000001;
  auVar80._12_4_ = 1;
  auVar80._16_4_ = 1;
  auVar80._20_4_ = 1;
  auVar80._24_4_ = 1;
  auVar80._28_4_ = 1;
  local_580 = ZEXT1632(auVar71);
  local_820 = vpermps_avx512vl(auVar80,local_580);
  auVar255 = ZEXT3264(local_820);
  auVar81._8_4_ = 2;
  auVar81._0_8_ = 0x200000002;
  auVar81._12_4_ = 2;
  auVar81._16_4_ = 2;
  auVar81._20_4_ = 2;
  auVar81._24_4_ = 2;
  auVar81._28_4_ = 2;
  local_840 = vpermps_avx512vl(auVar81,local_580);
  auVar256 = ZEXT3264(local_840);
  auVar78._8_4_ = 3;
  auVar78._0_8_ = 0x300000003;
  auVar78._12_4_ = 3;
  auVar78._16_4_ = 3;
  auVar78._20_4_ = 3;
  auVar78._24_4_ = 3;
  auVar78._28_4_ = 3;
  local_860 = vpermps_avx512vl(auVar78,local_580);
  auVar257 = ZEXT3264(local_860);
  local_880 = vbroadcastss_avx512vl(auVar69);
  auVar258 = ZEXT3264(local_880);
  local_5c0 = ZEXT1632(auVar69);
  local_8a0 = vpermps_avx512vl(auVar80,local_5c0);
  auVar260 = ZEXT3264(local_8a0);
  local_740 = vpermps_avx512vl(auVar81,local_5c0);
  auVar261 = ZEXT3264(local_740);
  local_760 = vpermps_avx512vl(auVar78,local_5c0);
  auVar263 = ZEXT3264(local_760);
  local_780 = vbroadcastss_avx512vl(auVar76);
  auVar264 = ZEXT3264(local_780);
  local_5a0 = ZEXT1632(auVar76);
  local_7a0 = vpermps_avx512vl(auVar80,local_5a0);
  auVar265 = ZEXT3264(local_7a0);
  local_2a0 = vpermps_avx2(auVar81,local_5a0);
  local_1e0 = vpermps_avx2(auVar78,local_5a0);
  local_200 = auVar70._0_4_;
  uStack_1fc = local_200;
  uStack_1f8 = local_200;
  uStack_1f4 = local_200;
  uStack_1f0 = local_200;
  uStack_1ec = local_200;
  uStack_1e8 = local_200;
  uStack_1e4 = local_200;
  _local_5e0 = ZEXT1632(auVar70);
  local_220 = vpermps_avx2(auVar80,_local_5e0);
  _local_240 = vpermps_avx2(auVar81,_local_5e0);
  local_2c0 = vpermps_avx2(auVar78,_local_5e0);
  auVar77 = vpermps_avx2(auVar81,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                    CONCAT48(aVar2.z * aVar2.z,
                                                             CONCAT44(aVar2.y * aVar2.y,
                                                                      aVar2.x * aVar2.x)))));
  auVar77 = vfmadd231ps_avx512vl(auVar77,local_720,local_720);
  local_260 = vfmadd231ps_avx512vl(auVar77,local_700,local_700);
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  auVar77._16_4_ = 0x7fffffff;
  auVar77._20_4_ = 0x7fffffff;
  auVar77._24_4_ = 0x7fffffff;
  auVar77._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_260,auVar77);
  local_280 = local_260;
  uVar58 = 0;
  bVar62 = 0;
  local_920 = 1;
  local_390 = ZEXT816(0x3f80000000000000);
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  do {
    auVar71 = vmovshdup_avx(local_390);
    auVar71 = vsubps_avx(auVar71,local_390);
    auVar129._0_4_ = auVar71._0_4_;
    fVar205 = auVar129._0_4_ * 0.04761905;
    uVar126 = local_390._0_4_;
    local_6e0._4_4_ = uVar126;
    local_6e0._0_4_ = uVar126;
    local_6e0._8_4_ = uVar126;
    local_6e0._12_4_ = uVar126;
    local_6e0._16_4_ = uVar126;
    local_6e0._20_4_ = uVar126;
    local_6e0._24_4_ = uVar126;
    local_6e0._28_4_ = uVar126;
    auVar129._4_4_ = auVar129._0_4_;
    auVar129._8_4_ = auVar129._0_4_;
    auVar129._12_4_ = auVar129._0_4_;
    local_540._16_4_ = auVar129._0_4_;
    local_540._0_16_ = auVar129;
    local_540._20_4_ = auVar129._0_4_;
    local_540._24_4_ = auVar129._0_4_;
    local_540._28_4_ = auVar129._0_4_;
    auVar71 = vfmadd231ps_fma(local_6e0,local_540,_DAT_01f7b040);
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar77 = vsubps_avx512vl(auVar77,ZEXT1632(auVar71));
    fVar178 = auVar71._0_4_;
    fVar199 = auVar71._4_4_;
    fVar200 = auVar71._8_4_;
    fVar201 = auVar71._12_4_;
    fVar203 = auVar77._0_4_;
    fVar204 = auVar77._4_4_;
    fVar223 = auVar77._8_4_;
    fVar160 = auVar77._12_4_;
    fVar224 = auVar77._16_4_;
    fVar225 = auVar77._20_4_;
    fVar226 = auVar77._24_4_;
    auVar79._4_4_ = fVar204 * fVar204 * -fVar199;
    auVar79._0_4_ = fVar203 * fVar203 * -fVar178;
    auVar79._8_4_ = fVar223 * fVar223 * -fVar200;
    auVar79._12_4_ = fVar160 * fVar160 * -fVar201;
    auVar79._16_4_ = fVar224 * fVar224 * -0.0;
    auVar79._20_4_ = fVar225 * fVar225 * -0.0;
    auVar79._24_4_ = fVar226 * fVar226 * -0.0;
    auVar79._28_4_ = 0x80000000;
    fVar234 = fVar178 * 3.0;
    fVar242 = fVar199 * 3.0;
    fVar243 = fVar200 * 3.0;
    fVar244 = fVar201 * 3.0;
    auVar241._28_36_ = auVar240._28_36_;
    auVar241._0_28_ = ZEXT1628(CONCAT412(fVar244,CONCAT48(fVar243,CONCAT44(fVar242,fVar234))));
    auVar101._0_4_ = (fVar234 + -5.0) * fVar178 * fVar178 + 2.0;
    auVar101._4_4_ = (fVar242 + -5.0) * fVar199 * fVar199 + 2.0;
    auVar101._8_4_ = (fVar243 + -5.0) * fVar200 * fVar200 + 2.0;
    auVar101._12_4_ = (fVar244 + -5.0) * fVar201 * fVar201 + 2.0;
    auVar101._16_4_ = 0x40000000;
    auVar101._20_4_ = 0x40000000;
    auVar101._24_4_ = 0x40000000;
    auVar101._28_4_ = DAT_01f7b040._28_4_ + 2.0;
    auVar248._0_4_ = fVar203 * fVar203;
    auVar248._4_4_ = fVar204 * fVar204;
    auVar248._8_4_ = fVar223 * fVar223;
    auVar248._12_4_ = fVar160 * fVar160;
    auVar248._16_4_ = fVar224 * fVar224;
    auVar248._20_4_ = fVar225 * fVar225;
    auVar248._28_36_ = auVar247._28_36_;
    auVar248._24_4_ = fVar226 * fVar226;
    auVar102._0_4_ = auVar248._0_4_ * (fVar203 * 3.0 + -5.0) + 2.0;
    auVar102._4_4_ = auVar248._4_4_ * (fVar204 * 3.0 + -5.0) + 2.0;
    auVar102._8_4_ = auVar248._8_4_ * (fVar223 * 3.0 + -5.0) + 2.0;
    auVar102._12_4_ = auVar248._12_4_ * (fVar160 * 3.0 + -5.0) + 2.0;
    auVar102._16_4_ = auVar248._16_4_ * (fVar224 * 3.0 + -5.0) + 2.0;
    auVar102._20_4_ = auVar248._20_4_ * (fVar225 * 3.0 + -5.0) + 2.0;
    auVar102._24_4_ = auVar248._24_4_ * (fVar226 * 3.0 + -5.0) + 2.0;
    auVar102._28_4_ = auVar233._28_4_ + -5.0 + 2.0;
    fVar202 = auVar77._28_4_;
    auVar84._4_4_ = fVar199 * fVar199 * -fVar204;
    auVar84._0_4_ = fVar178 * fVar178 * -fVar203;
    auVar84._8_4_ = fVar200 * fVar200 * -fVar223;
    auVar84._12_4_ = fVar201 * fVar201 * -fVar160;
    auVar84._16_4_ = -fVar224 * 0.0 * 0.0;
    auVar84._20_4_ = -fVar225 * 0.0 * 0.0;
    auVar84._24_4_ = -fVar226 * 0.0 * 0.0;
    auVar84._28_4_ = -fVar202;
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar77 = vmulps_avx512vl(auVar79,auVar78);
    auVar79 = vmulps_avx512vl(auVar101,auVar78);
    auVar80 = vmulps_avx512vl(auVar102,auVar78);
    auVar81 = vmulps_avx512vl(auVar84,auVar78);
    auVar90._4_4_ = uStack_1fc;
    auVar90._0_4_ = local_200;
    auVar90._8_4_ = uStack_1f8;
    auVar90._12_4_ = uStack_1f4;
    auVar90._16_4_ = uStack_1f0;
    auVar90._20_4_ = uStack_1ec;
    auVar90._24_4_ = uStack_1e8;
    auVar90._28_4_ = uStack_1e4;
    auVar82 = vmulps_avx512vl(auVar90,auVar81);
    auVar83 = vmulps_avx512vl(local_220,auVar81);
    auVar85._4_4_ = (float)local_240._4_4_ * auVar81._4_4_;
    auVar85._0_4_ = (float)local_240._0_4_ * auVar81._0_4_;
    auVar85._8_4_ = fStack_238 * auVar81._8_4_;
    auVar85._12_4_ = fStack_234 * auVar81._12_4_;
    auVar85._16_4_ = fStack_230 * auVar81._16_4_;
    auVar85._20_4_ = fStack_22c * auVar81._20_4_;
    auVar85._24_4_ = fStack_228 * auVar81._24_4_;
    auVar85._28_4_ = 0x80000000;
    auVar86._4_4_ = local_2c0._4_4_ * auVar81._4_4_;
    auVar86._0_4_ = local_2c0._0_4_ * auVar81._0_4_;
    auVar86._8_4_ = local_2c0._8_4_ * auVar81._8_4_;
    auVar86._12_4_ = local_2c0._12_4_ * auVar81._12_4_;
    auVar86._16_4_ = local_2c0._16_4_ * auVar81._16_4_;
    auVar86._20_4_ = local_2c0._20_4_ * auVar81._20_4_;
    auVar86._24_4_ = local_2c0._24_4_ * auVar81._24_4_;
    auVar86._28_4_ = auVar81._28_4_;
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar264._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar265._0_32_);
    auVar71 = vfmadd231ps_fma(auVar85,auVar80,local_2a0);
    auVar69 = vfmadd231ps_fma(auVar86,local_1e0,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar258._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar260._0_32_);
    auVar82 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar79,auVar261._0_32_);
    auVar83 = vfmadd231ps_avx512vl(ZEXT1632(auVar69),auVar263._0_32_,auVar79);
    auVar84 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar254._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar255._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar82,auVar77,auVar256._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar257._0_32_,auVar77);
    auVar88._4_4_ = (fVar204 + fVar204) * fVar199;
    auVar88._0_4_ = (fVar203 + fVar203) * fVar178;
    auVar88._8_4_ = (fVar223 + fVar223) * fVar200;
    auVar88._12_4_ = (fVar160 + fVar160) * fVar201;
    auVar88._16_4_ = (fVar224 + fVar224) * 0.0;
    auVar88._20_4_ = (fVar225 + fVar225) * 0.0;
    auVar88._24_4_ = (fVar226 + fVar226) * 0.0;
    auVar88._28_4_ = auVar79._28_4_;
    auVar77 = vsubps_avx(auVar88,auVar248._0_32_);
    auVar210._0_28_ =
         ZEXT1628(CONCAT412((fVar201 + fVar201) * (fVar244 + -5.0) + fVar244 * fVar201,
                            CONCAT48((fVar200 + fVar200) * (fVar243 + -5.0) + fVar243 * fVar200,
                                     CONCAT44((fVar199 + fVar199) * (fVar242 + -5.0) +
                                              fVar242 * fVar199,
                                              (fVar178 + fVar178) * (fVar234 + -5.0) +
                                              fVar234 * fVar178))));
    auVar210._28_4_ = auVar240._28_4_ + -5.0 + 0.0;
    auVar82._8_4_ = 0x40000000;
    auVar82._0_8_ = 0x4000000040000000;
    auVar82._12_4_ = 0x40000000;
    auVar82._16_4_ = 0x40000000;
    auVar82._20_4_ = 0x40000000;
    auVar82._24_4_ = 0x40000000;
    auVar82._28_4_ = 0x40000000;
    auVar80 = vaddps_avx512vl(auVar241._0_32_,auVar82);
    auVar89._4_4_ = (fVar204 + fVar204) * auVar80._4_4_;
    auVar89._0_4_ = (fVar203 + fVar203) * auVar80._0_4_;
    auVar89._8_4_ = (fVar223 + fVar223) * auVar80._8_4_;
    auVar89._12_4_ = (fVar160 + fVar160) * auVar80._12_4_;
    auVar89._16_4_ = (fVar224 + fVar224) * auVar80._16_4_;
    auVar89._20_4_ = (fVar225 + fVar225) * auVar80._20_4_;
    auVar89._24_4_ = (fVar226 + fVar226) * auVar80._24_4_;
    auVar89._28_4_ = auVar80._28_4_;
    auVar91._4_4_ = fVar204 * fVar204 * 3.0;
    auVar91._0_4_ = fVar203 * fVar203 * 3.0;
    auVar91._8_4_ = fVar223 * fVar223 * 3.0;
    auVar91._12_4_ = fVar160 * fVar160 * 3.0;
    auVar91._16_4_ = fVar224 * fVar224 * 3.0;
    auVar91._20_4_ = fVar225 * fVar225 * 3.0;
    auVar91._24_4_ = fVar226 * fVar226 * 3.0;
    auVar91._28_4_ = fVar202;
    auVar80 = vsubps_avx(auVar89,auVar91);
    auVar81 = vsubps_avx(ZEXT1632(CONCAT412(fVar201 * fVar201,
                                            CONCAT48(fVar200 * fVar200,
                                                     CONCAT44(fVar199 * fVar199,fVar178 * fVar178)))
                                 ),auVar88);
    auVar77 = vmulps_avx512vl(auVar77,auVar78);
    auVar82 = vmulps_avx512vl(auVar210,auVar78);
    auVar80 = vmulps_avx512vl(auVar80,auVar78);
    auVar81 = vmulps_avx512vl(auVar81,auVar78);
    auVar78 = vmulps_avx512vl(auVar90,auVar81);
    auVar87 = vmulps_avx512vl(local_220,auVar81);
    auVar92._4_4_ = (float)local_240._4_4_ * auVar81._4_4_;
    auVar92._0_4_ = (float)local_240._0_4_ * auVar81._0_4_;
    auVar92._8_4_ = fStack_238 * auVar81._8_4_;
    auVar92._12_4_ = fStack_234 * auVar81._12_4_;
    auVar92._16_4_ = fStack_230 * auVar81._16_4_;
    auVar92._20_4_ = fStack_22c * auVar81._20_4_;
    auVar92._24_4_ = fStack_228 * auVar81._24_4_;
    auVar92._28_4_ = auVar79._28_4_;
    auVar93._4_4_ = local_2c0._4_4_ * auVar81._4_4_;
    auVar93._0_4_ = local_2c0._0_4_ * auVar81._0_4_;
    auVar93._8_4_ = local_2c0._8_4_ * auVar81._8_4_;
    auVar93._12_4_ = local_2c0._12_4_ * auVar81._12_4_;
    auVar93._16_4_ = local_2c0._16_4_ * auVar81._16_4_;
    auVar93._20_4_ = local_2c0._20_4_ * auVar81._20_4_;
    auVar93._24_4_ = local_2c0._24_4_ * auVar81._24_4_;
    auVar93._28_4_ = auVar81._28_4_;
    auVar81 = vfmadd231ps_avx512vl(auVar78,auVar80,auVar264._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar87,auVar80,auVar265._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar92,auVar80,local_2a0);
    auVar71 = vfmadd231ps_fma(auVar93,local_1e0,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar258._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar78,auVar82,auVar260._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar261._0_32_);
    auVar82 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar263._0_32_,auVar82);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar254._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar255._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar77,auVar256._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar82,auVar257._0_32_,auVar77);
    auVar105._4_4_ = auVar80._4_4_ * fVar205;
    auVar105._0_4_ = auVar80._0_4_ * fVar205;
    auVar105._8_4_ = auVar80._8_4_ * fVar205;
    auVar105._12_4_ = auVar80._12_4_ * fVar205;
    auVar105._16_4_ = auVar80._16_4_ * fVar205;
    auVar105._20_4_ = auVar80._20_4_ * fVar205;
    auVar105._24_4_ = auVar80._24_4_ * fVar205;
    auVar105._28_4_ = local_2c0._28_4_;
    auVar106._4_4_ = auVar81._4_4_ * fVar205;
    auVar106._0_4_ = auVar81._0_4_ * fVar205;
    auVar106._8_4_ = auVar81._8_4_ * fVar205;
    auVar106._12_4_ = auVar81._12_4_ * fVar205;
    auVar106._16_4_ = auVar81._16_4_ * fVar205;
    auVar106._20_4_ = auVar81._20_4_ * fVar205;
    auVar106._24_4_ = auVar81._24_4_ * fVar205;
    auVar106._28_4_ = fVar202 + fVar202;
    auVar107._4_4_ = auVar78._4_4_ * fVar205;
    auVar107._0_4_ = auVar78._0_4_ * fVar205;
    auVar107._8_4_ = auVar78._8_4_ * fVar205;
    auVar107._12_4_ = auVar78._12_4_ * fVar205;
    auVar107._16_4_ = auVar78._16_4_ * fVar205;
    auVar107._20_4_ = auVar78._20_4_ * fVar205;
    auVar107._24_4_ = auVar78._24_4_ * fVar205;
    auVar107._28_4_ = auVar78._28_4_;
    fVar178 = fVar205 * auVar77._0_4_;
    fVar199 = fVar205 * auVar77._4_4_;
    auVar98._4_4_ = fVar199;
    auVar98._0_4_ = fVar178;
    fVar200 = fVar205 * auVar77._8_4_;
    auVar98._8_4_ = fVar200;
    fVar201 = fVar205 * auVar77._12_4_;
    auVar98._12_4_ = fVar201;
    fVar202 = fVar205 * auVar77._16_4_;
    auVar98._16_4_ = fVar202;
    fVar203 = fVar205 * auVar77._20_4_;
    auVar98._20_4_ = fVar203;
    fVar204 = fVar205 * auVar77._24_4_;
    auVar98._24_4_ = fVar204;
    auVar98._28_4_ = fVar205;
    auVar71 = vxorps_avx512vl(auVar261._0_16_,auVar261._0_16_);
    auVar88 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar240 = ZEXT3264(auVar88);
    auVar89 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar81 = ZEXT1632(auVar71);
    auVar90 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar81);
    auVar211._0_4_ = auVar83._0_4_ + fVar178;
    auVar211._4_4_ = auVar83._4_4_ + fVar199;
    auVar211._8_4_ = auVar83._8_4_ + fVar200;
    auVar211._12_4_ = auVar83._12_4_ + fVar201;
    auVar211._16_4_ = auVar83._16_4_ + fVar202;
    auVar211._20_4_ = auVar83._20_4_ + fVar203;
    auVar211._24_4_ = auVar83._24_4_ + fVar204;
    auVar211._28_4_ = auVar83._28_4_ + fVar205;
    auVar77 = vmaxps_avx(auVar83,auVar211);
    auVar80 = vminps_avx(auVar83,auVar211);
    auVar87 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar81);
    auVar91 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar81);
    auVar92 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar81);
    auVar101 = ZEXT1632(auVar71);
    auVar93 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar101);
    auVar81 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar101);
    auVar81 = vsubps_avx(auVar87,auVar81);
    auVar78 = vsubps_avx(auVar88,auVar84);
    auVar233 = ZEXT3264(auVar78);
    auVar82 = vsubps_avx(auVar89,auVar85);
    auVar79 = vsubps_avx(auVar90,auVar86);
    auVar83 = vmulps_avx512vl(auVar82,auVar107);
    auVar83 = vfmsub231ps_avx512vl(auVar83,auVar106,auVar79);
    auVar94 = vmulps_avx512vl(auVar79,auVar105);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar107,auVar78);
    auVar95 = vmulps_avx512vl(auVar78,auVar106);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar105,auVar82);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar83,auVar83);
    auVar83 = vmulps_avx512vl(auVar79,auVar79);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar82);
    auVar96 = vfmadd231ps_avx512vl(auVar83,auVar78,auVar78);
    auVar95 = vrcp14ps_avx512vl(auVar96);
    auVar83._8_4_ = 0x3f800000;
    auVar83._0_8_ = 0x3f8000003f800000;
    auVar83._12_4_ = 0x3f800000;
    auVar83._16_4_ = 0x3f800000;
    auVar83._20_4_ = 0x3f800000;
    auVar83._24_4_ = 0x3f800000;
    auVar83._28_4_ = 0x3f800000;
    auVar83 = vfnmadd213ps_avx512vl(auVar95,auVar96,auVar83);
    auVar83 = vfmadd132ps_avx512vl(auVar83,auVar95,auVar95);
    auVar94 = vmulps_avx512vl(auVar94,auVar83);
    auVar95 = vmulps_avx512vl(auVar82,auVar93);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar92,auVar79);
    auVar97 = vmulps_avx512vl(auVar79,auVar91);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar93,auVar78);
    auVar98 = vmulps_avx512vl(auVar78,auVar92);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar91,auVar82);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar97);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar95);
    auVar83 = vmulps_avx512vl(auVar95,auVar83);
    auVar83 = vmaxps_avx512vl(auVar94,auVar83);
    auVar83 = vsqrtps_avx512vl(auVar83);
    auVar94 = vmaxps_avx512vl(auVar81,auVar87);
    auVar77 = vmaxps_avx512vl(auVar77,auVar94);
    auVar97 = vaddps_avx512vl(auVar83,auVar77);
    auVar77 = vminps_avx(auVar81,auVar87);
    auVar77 = vminps_avx(auVar80,auVar77);
    auVar77 = vsubps_avx512vl(auVar77,auVar83);
    auVar87._8_4_ = 0x3f800002;
    auVar87._0_8_ = 0x3f8000023f800002;
    auVar87._12_4_ = 0x3f800002;
    auVar87._16_4_ = 0x3f800002;
    auVar87._20_4_ = 0x3f800002;
    auVar87._24_4_ = 0x3f800002;
    auVar87._28_4_ = 0x3f800002;
    auVar80 = vmulps_avx512vl(auVar97,auVar87);
    auVar94._8_4_ = 0x3f7ffffc;
    auVar94._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar94._12_4_ = 0x3f7ffffc;
    auVar94._16_4_ = 0x3f7ffffc;
    auVar94._20_4_ = 0x3f7ffffc;
    auVar94._24_4_ = 0x3f7ffffc;
    auVar94._28_4_ = 0x3f7ffffc;
    local_8c0 = vmulps_avx512vl(auVar77,auVar94);
    auVar77 = vmulps_avx512vl(auVar80,auVar80);
    auVar80 = vrsqrt14ps_avx512vl(auVar96);
    auVar95._8_4_ = 0xbf000000;
    auVar95._0_8_ = 0xbf000000bf000000;
    auVar95._12_4_ = 0xbf000000;
    auVar95._16_4_ = 0xbf000000;
    auVar95._20_4_ = 0xbf000000;
    auVar95._24_4_ = 0xbf000000;
    auVar95._28_4_ = 0xbf000000;
    auVar81 = vmulps_avx512vl(auVar96,auVar95);
    fVar205 = auVar80._0_4_;
    fVar178 = auVar80._4_4_;
    fVar199 = auVar80._8_4_;
    fVar200 = auVar80._12_4_;
    fVar201 = auVar80._16_4_;
    fVar202 = auVar80._20_4_;
    fVar203 = auVar80._24_4_;
    auVar99._4_4_ = fVar178 * fVar178 * fVar178 * auVar81._4_4_;
    auVar99._0_4_ = fVar205 * fVar205 * fVar205 * auVar81._0_4_;
    auVar99._8_4_ = fVar199 * fVar199 * fVar199 * auVar81._8_4_;
    auVar99._12_4_ = fVar200 * fVar200 * fVar200 * auVar81._12_4_;
    auVar99._16_4_ = fVar201 * fVar201 * fVar201 * auVar81._16_4_;
    auVar99._20_4_ = fVar202 * fVar202 * fVar202 * auVar81._20_4_;
    auVar99._24_4_ = fVar203 * fVar203 * fVar203 * auVar81._24_4_;
    auVar99._28_4_ = auVar97._28_4_;
    auVar96._8_4_ = 0x3fc00000;
    auVar96._0_8_ = 0x3fc000003fc00000;
    auVar96._12_4_ = 0x3fc00000;
    auVar96._16_4_ = 0x3fc00000;
    auVar96._20_4_ = 0x3fc00000;
    auVar96._24_4_ = 0x3fc00000;
    auVar96._28_4_ = 0x3fc00000;
    auVar80 = vfmadd231ps_avx512vl(auVar99,auVar80,auVar96);
    auVar81 = vmulps_avx512vl(auVar78,auVar80);
    auVar83 = vmulps_avx512vl(auVar82,auVar80);
    auVar87 = vmulps_avx512vl(auVar79,auVar80);
    auVar94 = vsubps_avx512vl(auVar101,auVar84);
    auVar95 = vsubps_avx512vl(auVar101,auVar85);
    auVar96 = vsubps_avx512vl(auVar101,auVar86);
    auVar100._4_4_ = uStack_43c;
    auVar100._0_4_ = local_440;
    auVar100._8_4_ = uStack_438;
    auVar100._12_4_ = uStack_434;
    auVar100._16_4_ = uStack_430;
    auVar100._20_4_ = uStack_42c;
    auVar100._24_4_ = uStack_428;
    auVar100._28_4_ = uStack_424;
    auVar97 = vmulps_avx512vl(auVar100,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar262._0_32_,auVar95);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar259._0_32_,auVar94);
    auVar98 = vmulps_avx512vl(auVar96,auVar96);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar94);
    auVar99 = vmulps_avx512vl(auVar100,auVar87);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar83,auVar262._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar81,auVar259._0_32_);
    auVar87 = vmulps_avx512vl(auVar96,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar87,auVar95,auVar83);
    auVar81 = vfmadd231ps_avx512vl(auVar83,auVar94,auVar81);
    auVar83 = vmulps_avx512vl(auVar99,auVar99);
    auVar87 = vsubps_avx512vl(local_260,auVar83);
    auVar100 = vmulps_avx512vl(auVar99,auVar81);
    auVar97 = vsubps_avx512vl(auVar97,auVar100);
    auVar100 = vaddps_avx512vl(auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar81,auVar81);
    local_900 = vsubps_avx512vl(auVar98,auVar97);
    auVar77 = vsubps_avx512vl(local_900,auVar77);
    local_560 = vmulps_avx512vl(auVar100,auVar100);
    auVar97._8_4_ = 0x40800000;
    auVar97._0_8_ = 0x4080000040800000;
    auVar97._12_4_ = 0x40800000;
    auVar97._16_4_ = 0x40800000;
    auVar97._20_4_ = 0x40800000;
    auVar97._24_4_ = 0x40800000;
    auVar97._28_4_ = 0x40800000;
    _local_660 = vmulps_avx512vl(auVar87,auVar97);
    auVar97 = vmulps_avx512vl(_local_660,auVar77);
    auVar97 = vsubps_avx512vl(local_560,auVar97);
    uVar65 = vcmpps_avx512vl(auVar97,auVar101,5);
    bVar56 = (byte)uVar65;
    if (bVar56 == 0) {
LAB_017eab7a:
      auVar262 = ZEXT3264(local_720);
      auVar259 = ZEXT3264(local_700);
      auVar247 = ZEXT3264(auVar90);
      auVar254 = ZEXT3264(local_800);
      auVar255 = ZEXT3264(local_820);
      auVar256 = ZEXT3264(local_840);
      auVar257 = ZEXT3264(local_860);
      auVar258 = ZEXT3264(local_880);
      auVar260 = ZEXT3264(local_8a0);
      auVar261 = ZEXT3264(local_740);
      auVar263 = ZEXT3264(local_760);
      auVar264 = ZEXT3264(local_780);
      auVar265 = ZEXT3264(local_7a0);
    }
    else {
      auVar97 = vsqrtps_avx512vl(auVar97);
      auVar98 = vaddps_avx512vl(auVar87,auVar87);
      local_480 = vrcp14ps_avx512vl(auVar98);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28._16_4_ = 0x3f800000;
      auVar28._20_4_ = 0x3f800000;
      auVar28._24_4_ = 0x3f800000;
      auVar28._28_4_ = 0x3f800000;
      auVar101 = vfnmadd213ps_avx512vl(local_480,auVar98,auVar28);
      auVar101 = vfmadd132ps_avx512vl(auVar101,local_480,local_480);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      local_4a0 = vxorps_avx512vl(auVar100,auVar29);
      auVar102 = vsubps_avx512vl(local_4a0,auVar97);
      local_680 = vmulps_avx512vl(auVar102,auVar101);
      auVar97 = vsubps_avx512vl(auVar97,auVar100);
      local_460 = vmulps_avx512vl(auVar97,auVar101);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vblendmps_avx512vl(auVar97,local_680);
      auVar103._0_4_ =
           (uint)(bVar56 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar101._0_4_;
      bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar103._4_4_ = (uint)bVar64 * auVar97._4_4_ | (uint)!bVar64 * auVar101._4_4_;
      bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar103._8_4_ = (uint)bVar64 * auVar97._8_4_ | (uint)!bVar64 * auVar101._8_4_;
      bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar103._12_4_ = (uint)bVar64 * auVar97._12_4_ | (uint)!bVar64 * auVar101._12_4_;
      bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar103._16_4_ = (uint)bVar64 * auVar97._16_4_ | (uint)!bVar64 * auVar101._16_4_;
      bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar103._20_4_ = (uint)bVar64 * auVar97._20_4_ | (uint)!bVar64 * auVar101._20_4_;
      bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar103._24_4_ = (uint)bVar64 * auVar97._24_4_ | (uint)!bVar64 * auVar101._24_4_;
      bVar64 = SUB81(uVar65 >> 7,0);
      auVar103._28_4_ = (uint)bVar64 * auVar97._28_4_ | (uint)!bVar64 * auVar101._28_4_;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar97,local_460);
      auVar104._0_4_ =
           (uint)(bVar56 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar97._0_4_;
      bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar104._4_4_ = (uint)bVar64 * auVar101._4_4_ | (uint)!bVar64 * auVar97._4_4_;
      bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar104._8_4_ = (uint)bVar64 * auVar101._8_4_ | (uint)!bVar64 * auVar97._8_4_;
      bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar104._12_4_ = (uint)bVar64 * auVar101._12_4_ | (uint)!bVar64 * auVar97._12_4_;
      bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar104._16_4_ = (uint)bVar64 * auVar101._16_4_ | (uint)!bVar64 * auVar97._16_4_;
      bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar104._20_4_ = (uint)bVar64 * auVar101._20_4_ | (uint)!bVar64 * auVar97._20_4_;
      bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar104._24_4_ = (uint)bVar64 * auVar101._24_4_ | (uint)!bVar64 * auVar97._24_4_;
      bVar64 = SUB81(uVar65 >> 7,0);
      auVar104._28_4_ = (uint)bVar64 * auVar101._28_4_ | (uint)!bVar64 * auVar97._28_4_;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar83,auVar97);
      local_4c0 = vmaxps_avx512vl(local_280,auVar97);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_4c0,auVar30);
      vandps_avx512vl(auVar87,auVar97);
      uVar63 = vcmpps_avx512vl(local_600,local_600,1);
      uVar65 = uVar65 & uVar63;
      bVar59 = (byte)uVar65;
      if (bVar59 != 0) {
        uVar63 = vcmpps_avx512vl(auVar77,_DAT_01f7b000,2);
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar87 = vblendmps_avx512vl(auVar77,auVar83);
        bVar60 = (byte)uVar63;
        uVar66 = (uint)(bVar60 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar60 & 1) * local_600._0_4_;
        bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
        uVar119 = (uint)bVar64 * auVar87._4_4_ | (uint)!bVar64 * local_600._4_4_;
        bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
        uVar120 = (uint)bVar64 * auVar87._8_4_ | (uint)!bVar64 * local_600._8_4_;
        bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
        uVar121 = (uint)bVar64 * auVar87._12_4_ | (uint)!bVar64 * local_600._12_4_;
        bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
        uVar122 = (uint)bVar64 * auVar87._16_4_ | (uint)!bVar64 * local_600._16_4_;
        bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
        uVar123 = (uint)bVar64 * auVar87._20_4_ | (uint)!bVar64 * local_600._20_4_;
        bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
        uVar124 = (uint)bVar64 * auVar87._24_4_ | (uint)!bVar64 * local_600._24_4_;
        bVar64 = SUB81(uVar63 >> 7,0);
        uVar125 = (uint)bVar64 * auVar87._28_4_ | (uint)!bVar64 * local_600._28_4_;
        auVar103._0_4_ = (bVar59 & 1) * uVar66 | !(bool)(bVar59 & 1) * auVar103._0_4_;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar103._4_4_ = bVar64 * uVar119 | !bVar64 * auVar103._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar103._8_4_ = bVar64 * uVar120 | !bVar64 * auVar103._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar103._12_4_ = bVar64 * uVar121 | !bVar64 * auVar103._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar103._16_4_ = bVar64 * uVar122 | !bVar64 * auVar103._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar103._20_4_ = bVar64 * uVar123 | !bVar64 * auVar103._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar103._24_4_ = bVar64 * uVar124 | !bVar64 * auVar103._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar103._28_4_ = bVar64 * uVar125 | !bVar64 * auVar103._28_4_;
        auVar77 = vblendmps_avx512vl(auVar83,auVar77);
        bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar11 = SUB81(uVar63 >> 7,0);
        auVar104._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar60 & 1) * auVar77._0_4_ | !(bool)(bVar60 & 1) * uVar66) |
             !(bool)(bVar59 & 1) * auVar104._0_4_;
        bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar104._4_4_ =
             (uint)bVar5 * ((uint)bVar64 * auVar77._4_4_ | !bVar64 * uVar119) |
             !bVar5 * auVar104._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar104._8_4_ =
             (uint)bVar64 * ((uint)bVar6 * auVar77._8_4_ | !bVar6 * uVar120) |
             !bVar64 * auVar104._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar104._12_4_ =
             (uint)bVar64 * ((uint)bVar7 * auVar77._12_4_ | !bVar7 * uVar121) |
             !bVar64 * auVar104._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar104._16_4_ =
             (uint)bVar64 * ((uint)bVar8 * auVar77._16_4_ | !bVar8 * uVar122) |
             !bVar64 * auVar104._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar104._20_4_ =
             (uint)bVar64 * ((uint)bVar9 * auVar77._20_4_ | !bVar9 * uVar123) |
             !bVar64 * auVar104._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar104._24_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar77._24_4_ | !bVar10 * uVar124) |
             !bVar64 * auVar104._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar104._28_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar77._28_4_ | !bVar11 * uVar125) |
             !bVar64 * auVar104._28_4_;
        bVar56 = (~bVar59 | bVar60) & bVar56;
      }
      auVar52._4_4_ = uStack_43c;
      auVar52._0_4_ = local_440;
      auVar52._8_4_ = uStack_438;
      auVar52._12_4_ = uStack_434;
      auVar52._16_4_ = uStack_430;
      auVar52._20_4_ = uStack_42c;
      auVar52._24_4_ = uStack_428;
      auVar52._28_4_ = uStack_424;
      if ((bVar56 & 0x7f) == 0) goto LAB_017eab7a;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar93 = vxorps_avx512vl(auVar93,auVar97);
      auVar91 = vxorps_avx512vl(auVar91,auVar97);
      auVar92 = vxorps_avx512vl(auVar92,auVar97);
      auVar71 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_510);
      auVar77 = vbroadcastss_avx512vl(auVar71);
      auVar77 = vmaxps_avx512vl(auVar77,auVar103);
      auVar71 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_510);
      auVar83 = vbroadcastss_avx512vl(auVar71);
      auVar83 = vminps_avx512vl(auVar83,auVar104);
      auVar87 = vmulps_avx512vl(auVar96,auVar107);
      auVar87 = vfmadd213ps_avx512vl(auVar95,auVar106,auVar87);
      auVar71 = vfmadd213ps_fma(auVar94,auVar105,auVar87);
      auVar87 = vmulps_avx512vl(auVar52,auVar107);
      auVar262 = ZEXT3264(local_720);
      auVar87 = vfmadd231ps_avx512vl(auVar87,local_720,auVar106);
      auVar87 = vfmadd231ps_avx512vl(auVar87,local_700,auVar105);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar87,auVar94);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar94,auVar95,1);
      auVar96 = vxorps_avx512vl(ZEXT1632(auVar71),auVar97);
      auVar105 = vrcp14ps_avx512vl(auVar87);
      auVar106 = vxorps_avx512vl(auVar87,auVar97);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar101 = vfnmadd213ps_avx512vl(auVar105,auVar87,auVar107);
      auVar71 = vfmadd132ps_fma(auVar101,auVar105,auVar105);
      fVar205 = auVar71._0_4_ * auVar96._0_4_;
      fVar178 = auVar71._4_4_ * auVar96._4_4_;
      auVar37._4_4_ = fVar178;
      auVar37._0_4_ = fVar205;
      fVar199 = auVar71._8_4_ * auVar96._8_4_;
      auVar37._8_4_ = fVar199;
      fVar200 = auVar71._12_4_ * auVar96._12_4_;
      auVar37._12_4_ = fVar200;
      fVar201 = auVar96._16_4_ * 0.0;
      auVar37._16_4_ = fVar201;
      fVar202 = auVar96._20_4_ * 0.0;
      auVar37._20_4_ = fVar202;
      fVar203 = auVar96._24_4_ * 0.0;
      auVar37._24_4_ = fVar203;
      auVar37._28_4_ = auVar96._28_4_;
      uVar16 = vcmpps_avx512vl(auVar87,auVar106,1);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar37,auVar101);
      auVar108._0_4_ =
           (uint)(bVar59 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar105._0_4_;
      bVar64 = (bool)(bVar59 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar64 * auVar102._4_4_ | (uint)!bVar64 * auVar105._4_4_;
      bVar64 = (bool)(bVar59 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar64 * auVar102._8_4_ | (uint)!bVar64 * auVar105._8_4_;
      bVar64 = (bool)(bVar59 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar64 * auVar102._12_4_ | (uint)!bVar64 * auVar105._12_4_;
      bVar64 = (bool)(bVar59 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar64 * auVar102._16_4_ | (uint)!bVar64 * auVar105._16_4_;
      bVar64 = (bool)(bVar59 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar64 * auVar102._20_4_ | (uint)!bVar64 * auVar105._20_4_;
      bVar64 = (bool)(bVar59 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar64 * auVar102._24_4_ | (uint)!bVar64 * auVar105._24_4_;
      auVar108._28_4_ =
           (uint)(bVar59 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar105._28_4_;
      auVar105 = vmaxps_avx512vl(auVar77,auVar108);
      uVar16 = vcmpps_avx512vl(auVar87,auVar106,6);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar109._0_4_ =
           (uint)(bVar59 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)fVar205;
      bVar64 = (bool)(bVar59 >> 1 & 1);
      auVar109._4_4_ = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * (int)fVar178;
      bVar64 = (bool)(bVar59 >> 2 & 1);
      auVar109._8_4_ = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * (int)fVar199;
      bVar64 = (bool)(bVar59 >> 3 & 1);
      auVar109._12_4_ = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * (int)fVar200;
      bVar64 = (bool)(bVar59 >> 4 & 1);
      auVar109._16_4_ = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * (int)fVar201;
      bVar64 = (bool)(bVar59 >> 5 & 1);
      auVar109._20_4_ = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * (int)fVar202;
      bVar64 = (bool)(bVar59 >> 6 & 1);
      auVar109._24_4_ = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * (int)fVar203;
      auVar109._28_4_ =
           (uint)(bVar59 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar96._28_4_;
      auVar96 = vminps_avx512vl(auVar83,auVar109);
      auVar77 = vsubps_avx(ZEXT832(0) << 0x20,auVar88);
      auVar83 = vsubps_avx(ZEXT832(0) << 0x20,auVar89);
      auVar88 = ZEXT832(0) << 0x20;
      auVar87 = vsubps_avx(auVar88,auVar90);
      auVar87 = vmulps_avx512vl(auVar87,auVar93);
      auVar83 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar83);
      auVar77 = vfmadd231ps_avx512vl(auVar83,auVar91,auVar77);
      auVar83 = vmulps_avx512vl(auVar52,auVar93);
      auVar259 = ZEXT3264(local_700);
      auVar83 = vfmadd231ps_avx512vl(auVar83,local_720,auVar92);
      auVar83 = vfmadd231ps_avx512vl(auVar83,local_700,auVar91);
      vandps_avx512vl(auVar83,auVar94);
      uVar14 = vcmpps_avx512vl(auVar83,auVar95,1);
      auVar77 = vxorps_avx512vl(auVar77,auVar97);
      auVar87 = vrcp14ps_avx512vl(auVar83);
      auVar90 = vxorps_avx512vl(auVar83,auVar97);
      auVar94 = vfnmadd213ps_avx512vl(auVar87,auVar83,auVar107);
      auVar71 = vfmadd132ps_fma(auVar94,auVar87,auVar87);
      fVar205 = auVar71._0_4_ * auVar77._0_4_;
      fVar178 = auVar71._4_4_ * auVar77._4_4_;
      auVar38._4_4_ = fVar178;
      auVar38._0_4_ = fVar205;
      fVar199 = auVar71._8_4_ * auVar77._8_4_;
      auVar38._8_4_ = fVar199;
      fVar200 = auVar71._12_4_ * auVar77._12_4_;
      auVar38._12_4_ = fVar200;
      fVar201 = auVar77._16_4_ * 0.0;
      auVar38._16_4_ = fVar201;
      fVar202 = auVar77._20_4_ * 0.0;
      auVar38._20_4_ = fVar202;
      fVar203 = auVar77._24_4_ * 0.0;
      auVar38._24_4_ = fVar203;
      auVar38._28_4_ = auVar77._28_4_;
      uVar16 = vcmpps_avx512vl(auVar83,auVar90,1);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar94 = vblendmps_avx512vl(auVar38,auVar101);
      auVar110._0_4_ =
           (uint)(bVar59 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar87._0_4_;
      bVar64 = (bool)(bVar59 >> 1 & 1);
      auVar110._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * auVar87._4_4_;
      bVar64 = (bool)(bVar59 >> 2 & 1);
      auVar110._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * auVar87._8_4_;
      bVar64 = (bool)(bVar59 >> 3 & 1);
      auVar110._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * auVar87._12_4_;
      bVar64 = (bool)(bVar59 >> 4 & 1);
      auVar110._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * auVar87._16_4_;
      bVar64 = (bool)(bVar59 >> 5 & 1);
      auVar110._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * auVar87._20_4_;
      bVar64 = (bool)(bVar59 >> 6 & 1);
      auVar110._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * auVar87._24_4_;
      auVar110._28_4_ =
           (uint)(bVar59 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar87._28_4_;
      local_420 = vmaxps_avx(auVar105,auVar110);
      uVar16 = vcmpps_avx512vl(auVar83,auVar90,6);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar111._0_4_ =
           (uint)(bVar59 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)fVar205;
      bVar64 = (bool)(bVar59 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * (int)fVar178;
      bVar64 = (bool)(bVar59 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * (int)fVar199;
      bVar64 = (bool)(bVar59 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * (int)fVar200;
      bVar64 = (bool)(bVar59 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * (int)fVar201;
      bVar64 = (bool)(bVar59 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * (int)fVar202;
      bVar64 = (bool)(bVar59 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * (int)fVar203;
      auVar111._28_4_ =
           (uint)(bVar59 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar77._28_4_;
      local_340 = vminps_avx(auVar96,auVar111);
      auVar240 = ZEXT3264(local_340);
      uVar14 = vcmpps_avx512vl(local_420,local_340,2);
      bVar56 = bVar56 & 0x7f & (byte)uVar14;
      if (bVar56 == 0) goto LAB_017eab7a;
      auVar77 = vmaxps_avx(auVar88,local_8c0);
      auVar83 = vfmadd213ps_avx512vl(local_680,auVar99,auVar81);
      fVar205 = auVar80._0_4_;
      fVar178 = auVar80._4_4_;
      auVar39._4_4_ = fVar178 * auVar83._4_4_;
      auVar39._0_4_ = fVar205 * auVar83._0_4_;
      fVar199 = auVar80._8_4_;
      auVar39._8_4_ = fVar199 * auVar83._8_4_;
      fVar200 = auVar80._12_4_;
      auVar39._12_4_ = fVar200 * auVar83._12_4_;
      fVar201 = auVar80._16_4_;
      auVar39._16_4_ = fVar201 * auVar83._16_4_;
      fVar202 = auVar80._20_4_;
      auVar39._20_4_ = fVar202 * auVar83._20_4_;
      fVar203 = auVar80._24_4_;
      auVar39._24_4_ = fVar203 * auVar83._24_4_;
      auVar39._28_4_ = auVar83._28_4_;
      auVar83 = vfmadd213ps_avx512vl(local_460,auVar99,auVar81);
      auVar40._4_4_ = fVar178 * auVar83._4_4_;
      auVar40._0_4_ = fVar205 * auVar83._0_4_;
      auVar40._8_4_ = fVar199 * auVar83._8_4_;
      auVar40._12_4_ = fVar200 * auVar83._12_4_;
      auVar40._16_4_ = fVar201 * auVar83._16_4_;
      auVar40._20_4_ = fVar202 * auVar83._20_4_;
      auVar40._24_4_ = fVar203 * auVar83._24_4_;
      auVar40._28_4_ = auVar83._28_4_;
      auVar83 = vminps_avx512vl(auVar39,auVar107);
      auVar87 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar83 = vmaxps_avx(auVar83,ZEXT832(0) << 0x20);
      auVar94 = vminps_avx512vl(auVar40,auVar107);
      auVar41._4_4_ = (auVar83._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar83._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar83._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar83._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar83._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar83._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar83._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar83._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar41,local_540,local_6e0);
      auVar83 = vmaxps_avx(auVar94,ZEXT832(0) << 0x20);
      auVar42._4_4_ = (auVar83._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar83._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar83._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar83._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar83._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar83._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar83._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar83._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar42,local_540,local_6e0);
      auVar43._4_4_ = auVar77._4_4_ * auVar77._4_4_;
      auVar43._0_4_ = auVar77._0_4_ * auVar77._0_4_;
      auVar43._8_4_ = auVar77._8_4_ * auVar77._8_4_;
      auVar43._12_4_ = auVar77._12_4_ * auVar77._12_4_;
      auVar43._16_4_ = auVar77._16_4_ * auVar77._16_4_;
      auVar43._20_4_ = auVar77._20_4_ * auVar77._20_4_;
      auVar43._24_4_ = auVar77._24_4_ * auVar77._24_4_;
      auVar43._28_4_ = auVar77._28_4_;
      auVar83 = vsubps_avx(local_900,auVar43);
      auVar44._4_4_ = auVar83._4_4_ * (float)local_660._4_4_;
      auVar44._0_4_ = auVar83._0_4_ * (float)local_660._0_4_;
      auVar44._8_4_ = auVar83._8_4_ * fStack_658;
      auVar44._12_4_ = auVar83._12_4_ * fStack_654;
      auVar44._16_4_ = auVar83._16_4_ * fStack_650;
      auVar44._20_4_ = auVar83._20_4_ * fStack_64c;
      auVar44._24_4_ = auVar83._24_4_ * fStack_648;
      auVar44._28_4_ = auVar77._28_4_;
      auVar77 = vsubps_avx(local_560,auVar44);
      uVar14 = vcmpps_avx512vl(auVar77,ZEXT832(0) << 0x20,5);
      bVar59 = (byte)uVar14;
      auVar261 = ZEXT3264(local_740);
      auVar263 = ZEXT3264(local_760);
      auVar264 = ZEXT3264(local_780);
      auVar265 = ZEXT3264(local_7a0);
      if (bVar59 == 0) {
        bVar59 = 0;
        auVar77 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar247 = ZEXT864(0) << 0x20;
        auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar112._8_4_ = 0x7f800000;
        auVar112._0_8_ = 0x7f8000007f800000;
        auVar112._12_4_ = 0x7f800000;
        auVar112._16_4_ = 0x7f800000;
        auVar112._20_4_ = 0x7f800000;
        auVar112._24_4_ = 0x7f800000;
        auVar112._28_4_ = 0x7f800000;
        auVar113._8_4_ = 0xff800000;
        auVar113._0_8_ = 0xff800000ff800000;
        auVar113._12_4_ = 0xff800000;
        auVar113._16_4_ = 0xff800000;
        auVar113._20_4_ = 0xff800000;
        auVar113._24_4_ = 0xff800000;
        auVar113._28_4_ = 0xff800000;
      }
      else {
        auVar69 = vxorps_avx512vl(auVar129,auVar129);
        uVar65 = vcmpps_avx512vl(auVar77,auVar88,5);
        auVar77 = vsqrtps_avx(auVar77);
        auVar87 = vfnmadd213ps_avx512vl(auVar98,local_480,auVar107);
        auVar95 = vfmadd132ps_avx512vl(auVar87,local_480,local_480);
        auVar87 = vsubps_avx(local_4a0,auVar77);
        auVar96 = vmulps_avx512vl(auVar87,auVar95);
        auVar77 = vsubps_avx512vl(auVar77,auVar100);
        auVar97 = vmulps_avx512vl(auVar77,auVar95);
        auVar77 = vfmadd213ps_avx512vl(auVar99,auVar96,auVar81);
        auVar45._4_4_ = fVar178 * auVar77._4_4_;
        auVar45._0_4_ = fVar205 * auVar77._0_4_;
        auVar45._8_4_ = fVar199 * auVar77._8_4_;
        auVar45._12_4_ = fVar200 * auVar77._12_4_;
        auVar45._16_4_ = fVar201 * auVar77._16_4_;
        auVar45._20_4_ = fVar202 * auVar77._20_4_;
        auVar45._24_4_ = fVar203 * auVar77._24_4_;
        auVar45._28_4_ = auVar94._28_4_;
        auVar77 = vmulps_avx512vl(local_700,auVar96);
        auVar87 = vmulps_avx512vl(local_720,auVar96);
        auVar53._4_4_ = uStack_43c;
        auVar53._0_4_ = local_440;
        auVar53._8_4_ = uStack_438;
        auVar53._12_4_ = uStack_434;
        auVar53._16_4_ = uStack_430;
        auVar53._20_4_ = uStack_42c;
        auVar53._24_4_ = uStack_428;
        auVar53._28_4_ = uStack_424;
        auVar88 = vmulps_avx512vl(auVar53,auVar96);
        auVar94 = vfmadd213ps_avx512vl(auVar78,auVar45,auVar84);
        auVar94 = vsubps_avx512vl(auVar77,auVar94);
        auVar77 = vfmadd213ps_avx512vl(auVar82,auVar45,auVar85);
        auVar95 = vsubps_avx512vl(auVar87,auVar77);
        auVar71 = vfmadd213ps_fma(auVar45,auVar79,auVar86);
        auVar77 = vsubps_avx(auVar88,ZEXT1632(auVar71));
        auVar245 = auVar77._0_28_;
        auVar77 = vfmadd213ps_avx512vl(auVar99,auVar97,auVar81);
        auVar46._4_4_ = fVar178 * auVar77._4_4_;
        auVar46._0_4_ = fVar205 * auVar77._0_4_;
        auVar46._8_4_ = fVar199 * auVar77._8_4_;
        auVar46._12_4_ = fVar200 * auVar77._12_4_;
        auVar46._16_4_ = fVar201 * auVar77._16_4_;
        auVar46._20_4_ = fVar202 * auVar77._20_4_;
        auVar46._24_4_ = fVar203 * auVar77._24_4_;
        auVar46._28_4_ = auVar80._28_4_;
        auVar77 = vmulps_avx512vl(local_700,auVar97);
        auVar80 = vmulps_avx512vl(local_720,auVar97);
        auVar81 = vmulps_avx512vl(auVar53,auVar97);
        auVar71 = vfmadd213ps_fma(auVar78,auVar46,auVar84);
        auVar87 = vsubps_avx(auVar77,ZEXT1632(auVar71));
        auVar71 = vfmadd213ps_fma(auVar82,auVar46,auVar85);
        auVar77 = vsubps_avx(auVar80,ZEXT1632(auVar71));
        auVar71 = vfmadd213ps_fma(auVar79,auVar46,auVar86);
        auVar80 = vsubps_avx512vl(auVar81,ZEXT1632(auVar71));
        auVar247 = ZEXT3264(auVar80);
        auVar138._8_4_ = 0x7f800000;
        auVar138._0_8_ = 0x7f8000007f800000;
        auVar138._12_4_ = 0x7f800000;
        auVar138._16_4_ = 0x7f800000;
        auVar138._20_4_ = 0x7f800000;
        auVar138._24_4_ = 0x7f800000;
        auVar138._28_4_ = 0x7f800000;
        auVar80 = vblendmps_avx512vl(auVar138,auVar96);
        bVar64 = (bool)((byte)uVar65 & 1);
        auVar112._0_4_ = (uint)bVar64 * auVar80._0_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar112._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar112._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar112._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar112._28_4_ = (uint)bVar64 * auVar80._28_4_ | (uint)!bVar64 * 0x7f800000;
        auVar175._8_4_ = 0xff800000;
        auVar175._0_8_ = 0xff800000ff800000;
        auVar175._12_4_ = 0xff800000;
        auVar175._16_4_ = 0xff800000;
        auVar175._20_4_ = 0xff800000;
        auVar175._24_4_ = 0xff800000;
        auVar175._28_4_ = 0xff800000;
        auVar80 = vblendmps_avx512vl(auVar175,auVar97);
        bVar64 = (bool)((byte)uVar65 & 1);
        auVar113._0_4_ = (uint)bVar64 * auVar80._0_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar113._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar113._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar113._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar113._28_4_ = (uint)bVar64 * auVar80._28_4_ | (uint)!bVar64 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar80 = vmulps_avx512vl(local_4c0,auVar31);
        uVar63 = vcmpps_avx512vl(auVar80,local_600,0xe);
        uVar65 = uVar65 & uVar63;
        bVar60 = (byte)uVar65;
        if (bVar60 != 0) {
          uVar63 = vcmpps_avx512vl(auVar83,ZEXT1632(auVar69),2);
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar81 = vblendmps_avx512vl(auVar231,auVar249);
          bVar57 = (byte)uVar63;
          uVar66 = (uint)(bVar57 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar80._0_4_;
          bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
          uVar119 = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * auVar80._4_4_;
          bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
          uVar120 = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * auVar80._8_4_;
          bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
          uVar121 = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * auVar80._12_4_;
          bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
          uVar122 = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * auVar80._16_4_;
          bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
          uVar123 = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * auVar80._20_4_;
          bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
          uVar124 = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * auVar80._24_4_;
          bVar64 = SUB81(uVar63 >> 7,0);
          uVar125 = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * auVar80._28_4_;
          auVar112._0_4_ = (bVar60 & 1) * uVar66 | !(bool)(bVar60 & 1) * auVar112._0_4_;
          bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar112._4_4_ = bVar64 * uVar119 | !bVar64 * auVar112._4_4_;
          bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar112._8_4_ = bVar64 * uVar120 | !bVar64 * auVar112._8_4_;
          bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar112._12_4_ = bVar64 * uVar121 | !bVar64 * auVar112._12_4_;
          bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar112._16_4_ = bVar64 * uVar122 | !bVar64 * auVar112._16_4_;
          bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar112._20_4_ = bVar64 * uVar123 | !bVar64 * auVar112._20_4_;
          bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar112._24_4_ = bVar64 * uVar124 | !bVar64 * auVar112._24_4_;
          bVar64 = SUB81(uVar65 >> 7,0);
          auVar112._28_4_ = bVar64 * uVar125 | !bVar64 * auVar112._28_4_;
          auVar80 = vblendmps_avx512vl(auVar249,auVar231);
          bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar113._0_4_ =
               (uint)(bVar60 & 1) *
               ((uint)(bVar57 & 1) * auVar80._0_4_ | !(bool)(bVar57 & 1) * uVar66) |
               !(bool)(bVar60 & 1) * auVar113._0_4_;
          bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar113._4_4_ =
               (uint)bVar5 * ((uint)bVar64 * auVar80._4_4_ | !bVar64 * uVar119) |
               !bVar5 * auVar113._4_4_;
          bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar113._8_4_ =
               (uint)bVar64 * ((uint)bVar6 * auVar80._8_4_ | !bVar6 * uVar120) |
               !bVar64 * auVar113._8_4_;
          bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar113._12_4_ =
               (uint)bVar64 * ((uint)bVar7 * auVar80._12_4_ | !bVar7 * uVar121) |
               !bVar64 * auVar113._12_4_;
          bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar113._16_4_ =
               (uint)bVar64 * ((uint)bVar8 * auVar80._16_4_ | !bVar8 * uVar122) |
               !bVar64 * auVar113._16_4_;
          bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar113._20_4_ =
               (uint)bVar64 * ((uint)bVar9 * auVar80._20_4_ | !bVar9 * uVar123) |
               !bVar64 * auVar113._20_4_;
          bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar113._24_4_ =
               (uint)bVar64 * ((uint)bVar10 * auVar80._24_4_ | !bVar10 * uVar124) |
               !bVar64 * auVar113._24_4_;
          bVar64 = SUB81(uVar65 >> 7,0);
          auVar113._28_4_ =
               (uint)bVar64 * ((uint)bVar11 * auVar80._28_4_ | !bVar11 * uVar125) |
               !bVar64 * auVar113._28_4_;
          bVar59 = (~bVar60 | bVar57) & bVar59;
        }
      }
      auVar254 = ZEXT3264(local_800);
      auVar255 = ZEXT3264(local_820);
      auVar256 = ZEXT3264(local_840);
      auVar257 = ZEXT3264(local_860);
      auVar258 = ZEXT3264(local_880);
      auVar260 = ZEXT3264(local_8a0);
      uVar126 = *(undefined4 *)&(ray->dir).field_0;
      auVar222._4_4_ = uVar126;
      auVar222._0_4_ = uVar126;
      auVar222._8_4_ = uVar126;
      auVar222._12_4_ = uVar126;
      auVar222._16_4_ = uVar126;
      auVar222._20_4_ = uVar126;
      auVar222._24_4_ = uVar126;
      auVar222._28_4_ = uVar126;
      uVar126 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar232._4_4_ = uVar126;
      auVar232._0_4_ = uVar126;
      auVar232._8_4_ = uVar126;
      auVar232._12_4_ = uVar126;
      auVar232._16_4_ = uVar126;
      auVar232._20_4_ = uVar126;
      auVar232._24_4_ = uVar126;
      auVar232._28_4_ = uVar126;
      auVar233 = ZEXT3264(auVar232);
      fVar205 = (ray->dir).field_0.m128[2];
      auVar220._0_4_ = fVar205 * auVar247._0_4_;
      auVar220._4_4_ = fVar205 * auVar247._4_4_;
      auVar220._8_4_ = fVar205 * auVar247._8_4_;
      auVar220._12_4_ = fVar205 * auVar247._12_4_;
      auVar220._16_4_ = fVar205 * auVar247._16_4_;
      auVar220._20_4_ = fVar205 * auVar247._20_4_;
      auVar220._28_36_ = auVar247._28_36_;
      auVar220._24_4_ = fVar205 * auVar247._24_4_;
      auVar71 = vfmadd231ps_fma(auVar220._0_32_,auVar232,auVar77);
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar222,auVar87);
      auVar246._8_4_ = 0x7fffffff;
      auVar246._0_8_ = 0x7fffffff7fffffff;
      auVar246._12_4_ = 0x7fffffff;
      auVar246._16_4_ = 0x7fffffff;
      auVar246._20_4_ = 0x7fffffff;
      auVar246._24_4_ = 0x7fffffff;
      auVar246._28_4_ = 0x7fffffff;
      auVar247 = ZEXT3264(auVar246);
      auVar77 = vandps_avx(auVar246,ZEXT1632(auVar71));
      _local_320 = local_420;
      auVar219._8_4_ = 0x3e99999a;
      auVar219._0_8_ = 0x3e99999a3e99999a;
      auVar219._12_4_ = 0x3e99999a;
      auVar219._16_4_ = 0x3e99999a;
      auVar219._20_4_ = 0x3e99999a;
      auVar219._24_4_ = 0x3e99999a;
      auVar219._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar77,auVar219,1);
      _local_3e0 = vmaxps_avx(local_420,auVar113);
      auVar77 = vminps_avx(local_340,auVar112);
      uVar16 = vcmpps_avx512vl(local_420,auVar77,2);
      bVar60 = (byte)uVar16 & bVar56;
      uVar15 = vcmpps_avx512vl(_local_3e0,local_340,2);
      if ((bVar56 & ((byte)uVar15 | (byte)uVar16)) != 0) {
        local_7a8 = (uint)(byte)((byte)uVar14 | ~bVar59);
        auVar47._4_4_ = auVar245._4_4_ * fVar205;
        auVar47._0_4_ = auVar245._0_4_ * fVar205;
        auVar47._8_4_ = auVar245._8_4_ * fVar205;
        auVar47._12_4_ = auVar245._12_4_ * fVar205;
        auVar47._16_4_ = auVar245._16_4_ * fVar205;
        auVar47._20_4_ = auVar245._20_4_ * fVar205;
        auVar47._24_4_ = auVar245._24_4_ * fVar205;
        auVar47._28_4_ = auVar77._28_4_;
        auVar71 = vfmadd213ps_fma(auVar95,auVar232,auVar47);
        auVar71 = vfmadd213ps_fma(auVar94,auVar222,ZEXT1632(auVar71));
        auVar77 = vandps_avx(auVar246,ZEXT1632(auVar71));
        uVar14 = vcmpps_avx512vl(auVar77,auVar219,1);
        bVar59 = (byte)uVar14 | ~bVar59;
        auVar140._8_4_ = 2;
        auVar140._0_8_ = 0x200000002;
        auVar140._12_4_ = 2;
        auVar140._16_4_ = 2;
        auVar140._20_4_ = 2;
        auVar140._24_4_ = 2;
        auVar140._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar140,auVar32);
        local_2e0._0_4_ = (uint)(bVar59 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        local_2e0._4_4_ = (uint)bVar64 * auVar77._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        local_2e0._8_4_ = (uint)bVar64 * auVar77._8_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        local_2e0._12_4_ = (uint)bVar64 * auVar77._12_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        local_2e0._16_4_ = (uint)bVar64 * auVar77._16_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        local_2e0._20_4_ = (uint)bVar64 * auVar77._20_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        local_2e0._24_4_ = (uint)bVar64 * auVar77._24_4_ | (uint)!bVar64 * 2;
        local_2e0._28_4_ = (uint)(bVar59 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
        local_380 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_380,local_2e0,5);
        local_7a4 = (uint)bVar60;
        local_3c0 = local_420._0_4_ + (float)local_400._0_4_;
        fStack_3bc = local_420._4_4_ + (float)local_400._4_4_;
        fStack_3b8 = local_420._8_4_ + fStack_3f8;
        fStack_3b4 = local_420._12_4_ + fStack_3f4;
        fStack_3b0 = local_420._16_4_ + fStack_3f0;
        fStack_3ac = local_420._20_4_ + fStack_3ec;
        fStack_3a8 = local_420._24_4_ + fStack_3e8;
        fStack_3a4 = local_420._28_4_ + fStack_3e4;
        _local_360 = _local_3e0;
        for (bVar60 = (byte)uVar14 & bVar60; auVar77 = local_8c0, bVar60 != 0;
            bVar60 = ~bVar59 & bVar60 & (byte)uVar14) {
          auVar141._8_4_ = 0x7f800000;
          auVar141._0_8_ = 0x7f8000007f800000;
          auVar141._12_4_ = 0x7f800000;
          auVar141._16_4_ = 0x7f800000;
          auVar141._20_4_ = 0x7f800000;
          auVar141._24_4_ = 0x7f800000;
          auVar141._28_4_ = 0x7f800000;
          auVar80 = vblendmps_avx512vl(auVar141,local_420);
          auVar115._0_4_ =
               (uint)(bVar60 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
          bVar64 = (bool)(bVar60 >> 1 & 1);
          auVar115._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar60 >> 2 & 1);
          auVar115._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar60 >> 3 & 1);
          auVar115._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar60 >> 4 & 1);
          auVar115._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar60 >> 5 & 1);
          auVar115._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar60 >> 6 & 1);
          auVar115._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 0x7f800000;
          auVar115._28_4_ =
               (uint)(bVar60 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar60 >> 7) * 0x7f800000;
          auVar80 = vshufps_avx(auVar115,auVar115,0xb1);
          auVar80 = vminps_avx(auVar115,auVar80);
          auVar81 = vshufpd_avx(auVar80,auVar80,5);
          auVar80 = vminps_avx(auVar80,auVar81);
          auVar81 = vpermpd_avx2(auVar80,0x4e);
          auVar80 = vminps_avx(auVar80,auVar81);
          uVar14 = vcmpps_avx512vl(auVar115,auVar80,0);
          bVar57 = (byte)uVar14 & bVar60;
          bVar59 = bVar60;
          if (bVar57 != 0) {
            bVar59 = bVar57;
          }
          iVar17 = 0;
          for (uVar66 = (uint)bVar59; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar59 = '\x01' << ((byte)iVar17 & 0x1f);
          auVar233 = ZEXT464(*(uint *)(local_320 + (uint)(iVar17 << 2)));
          aVar1 = (ray->dir).field_0;
          local_540._0_16_ = (undefined1  [16])aVar1;
          auVar71 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar71._0_4_ < 0.0) {
            local_8c0[1] = 0;
            local_8c0[0] = bVar60;
            local_8c0._2_30_ = auVar77._2_30_;
            local_900._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            local_6e0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar17 << 2)));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar247 = ZEXT1664(auVar247._0_16_);
            fVar205 = sqrtf(auVar71._0_4_);
            auVar233 = ZEXT1664(local_6e0._0_16_);
            bVar60 = local_8c0[0];
            auVar265 = ZEXT3264(local_7a0);
            auVar264 = ZEXT3264(local_780);
            auVar263 = ZEXT3264(local_760);
            auVar261 = ZEXT3264(local_740);
            auVar260 = ZEXT3264(local_8a0);
            auVar258 = ZEXT3264(local_880);
            auVar257 = ZEXT3264(local_860);
            auVar256 = ZEXT3264(local_840);
            auVar255 = ZEXT3264(local_820);
            auVar254 = ZEXT3264(local_800);
            auVar262 = ZEXT3264(local_720);
            auVar259 = ZEXT3264(local_700);
            auVar71 = local_900._0_16_;
          }
          else {
            auVar71 = vsqrtss_avx(auVar71,auVar71);
            fVar205 = auVar71._0_4_;
            auVar71 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
          }
          uVar65 = (ulong)bVar59;
          auVar70 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar69 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar76 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar72 = vminps_avx(auVar70,auVar76);
          auVar70 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar76 = vmaxps_avx(auVar69,auVar70);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar72,auVar181);
          auVar70 = vandps_avx(auVar76,auVar181);
          auVar69 = vmaxps_avx(auVar69,auVar70);
          auVar70 = vmovshdup_avx(auVar69);
          auVar70 = vmaxss_avx(auVar70,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar70);
          fVar178 = auVar69._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar76,auVar76,0xff);
          auVar71 = vinsertps_avx(auVar233._0_16_,auVar71,0x10);
          uVar63 = 0;
          while( true ) {
            bVar57 = (byte)uVar65;
            if (uVar63 == 5) break;
            uVar126 = auVar71._0_4_;
            auVar131._4_4_ = uVar126;
            auVar131._0_4_ = uVar126;
            auVar131._8_4_ = uVar126;
            auVar131._12_4_ = uVar126;
            auVar70 = vfmadd132ps_fma(auVar131,ZEXT816(0) << 0x40,local_540._0_16_);
            auVar69 = vmovshdup_avx(auVar71);
            fVar203 = auVar69._0_4_;
            fVar204 = 1.0 - fVar203;
            fVar199 = fVar203 * fVar203;
            auVar237 = SUB6416(ZEXT464(0x40400000),0);
            auVar74 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar72 = vfmadd213ss_fma(auVar237,auVar69,auVar74);
            auVar76 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar199),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar73 = vfmadd213ss_fma(auVar237,ZEXT416((uint)fVar204),auVar74);
            auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)(fVar204 * fVar204)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar200 = fVar204 * fVar204 * -fVar203 * 0.5;
            fVar201 = auVar76._0_4_ * 0.5;
            fVar202 = auVar73._0_4_ * 0.5;
            fVar203 = fVar203 * fVar203 * -fVar204 * 0.5;
            auVar182._0_4_ = fVar203 * (float)local_5e0._0_4_;
            auVar182._4_4_ = fVar203 * (float)local_5e0._4_4_;
            auVar182._8_4_ = fVar203 * fStack_5d8;
            auVar182._12_4_ = fVar203 * fStack_5d4;
            auVar208._4_4_ = fVar202;
            auVar208._0_4_ = fVar202;
            auVar208._8_4_ = fVar202;
            auVar208._12_4_ = fVar202;
            auVar76 = vfmadd132ps_fma(auVar208,auVar182,local_5a0._0_16_);
            auVar163._4_4_ = fVar201;
            auVar163._0_4_ = fVar201;
            auVar163._8_4_ = fVar201;
            auVar163._12_4_ = fVar201;
            auVar76 = vfmadd132ps_fma(auVar163,auVar76,local_5c0._0_16_);
            auVar183._4_4_ = fVar200;
            auVar183._0_4_ = fVar200;
            auVar183._8_4_ = fVar200;
            auVar183._12_4_ = fVar200;
            auVar76 = vfmadd132ps_fma(auVar183,auVar76,local_580._0_16_);
            auVar73 = vfmadd231ss_fma(auVar74,auVar69,ZEXT416(0x41100000));
            local_480._0_16_ = auVar73;
            auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar69,ZEXT416(0x40800000));
            local_4a0._0_16_ = auVar73;
            local_8c0._0_16_ = auVar69;
            auVar69 = vfmadd213ss_fma(auVar237,auVar69,ZEXT416(0xbf800000));
            local_4c0._0_16_ = auVar69;
            local_460._0_16_ = auVar76;
            auVar69 = vsubps_avx(auVar70,auVar76);
            local_900._0_16_ = auVar69;
            auVar69 = vdpps_avx(auVar69,auVar69,0x7f);
            local_6e0._0_16_ = auVar69;
            local_560._0_16_ = auVar71;
            if (auVar69._0_4_ < 0.0) {
              local_660._0_4_ = auVar72._0_4_;
              local_680._0_16_ = ZEXT416((uint)fVar204);
              local_600._0_4_ = fVar199;
              local_7c0._0_4_ = fVar204 * -2.0;
              auVar233._0_4_ = sqrtf(auVar69._0_4_);
              auVar233._4_60_ = extraout_var;
              auVar72 = ZEXT416((uint)local_660._0_4_);
              auVar71 = auVar233._0_16_;
              uVar65 = extraout_RAX;
              auVar69 = local_680._0_16_;
            }
            else {
              auVar71 = vsqrtss_avx(auVar69,auVar69);
              local_7c0._0_4_ = fVar204 * -2.0;
              local_600._0_4_ = fVar199;
              auVar69 = ZEXT416((uint)fVar204);
            }
            fVar200 = auVar69._0_4_;
            fVar199 = local_8c0._0_4_;
            auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar199 * (fVar200 + fVar200))),auVar69,
                                       auVar69);
            auVar69 = vfmadd213ss_fma(auVar72,ZEXT416((uint)(fVar199 + fVar199)),
                                      ZEXT416((uint)(fVar199 * fVar199 * 3.0)));
            auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8c0._0_16_,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * fVar200 * -3.0)),
                                      ZEXT416((uint)(fVar200 + fVar200)),auVar70);
            auVar70 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),local_8c0._0_16_,
                                      ZEXT416((uint)local_600._0_4_));
            fVar199 = auVar73._0_4_ * 0.5;
            fVar200 = auVar69._0_4_ * 0.5;
            fVar201 = auVar76._0_4_ * 0.5;
            fVar202 = auVar70._0_4_ * 0.5;
            auVar184._0_4_ = fVar202 * (float)local_5e0._0_4_;
            auVar184._4_4_ = fVar202 * (float)local_5e0._4_4_;
            auVar184._8_4_ = fVar202 * fStack_5d8;
            auVar184._12_4_ = fVar202 * fStack_5d4;
            auVar164._4_4_ = fVar201;
            auVar164._0_4_ = fVar201;
            auVar164._8_4_ = fVar201;
            auVar164._12_4_ = fVar201;
            auVar69 = vfmadd132ps_fma(auVar164,auVar184,local_5a0._0_16_);
            auVar145._4_4_ = fVar200;
            auVar145._0_4_ = fVar200;
            auVar145._8_4_ = fVar200;
            auVar145._12_4_ = fVar200;
            auVar69 = vfmadd132ps_fma(auVar145,auVar69,local_5c0._0_16_);
            auVar250._4_4_ = fVar199;
            auVar250._0_4_ = fVar199;
            auVar250._8_4_ = fVar199;
            auVar250._12_4_ = fVar199;
            _local_660 = vfmadd132ps_fma(auVar250,auVar69,local_580._0_16_);
            local_600._0_16_ = vdpps_avx(_local_660,_local_660,0x7f);
            auVar48._12_4_ = 0;
            auVar48._0_12_ = ZEXT812(0);
            fVar199 = local_600._0_4_;
            local_7d0 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar199));
            fVar200 = local_7d0._0_4_;
            local_7c0 = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar199));
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar70 = vxorps_avx512vl(local_600._0_16_,auVar20);
            auVar69 = vfnmadd213ss_fma(local_7c0,local_600._0_16_,SUB6416(ZEXT464(0x40000000),0));
            local_680._0_4_ = auVar71._0_4_;
            if (fVar199 < auVar70._0_4_) {
              local_7e0._0_4_ = fVar199 * -0.5;
              fVar201 = sqrtf(fVar199);
              auVar71 = ZEXT416((uint)local_680._0_4_);
              uVar65 = extraout_RAX_00;
              fVar199 = (float)local_7e0._0_4_;
              auVar70 = _local_660;
            }
            else {
              auVar70 = vsqrtss_avx(local_600._0_16_,local_600._0_16_);
              fVar201 = auVar70._0_4_;
              fVar199 = fVar199 * -0.5;
              auVar70 = _local_660;
            }
            fVar202 = local_7d0._0_4_;
            fVar199 = fVar200 * 1.5 + fVar199 * fVar202 * fVar202 * fVar202;
            local_7d0._0_4_ = auVar70._0_4_ * fVar199;
            local_7d0._4_4_ = auVar70._4_4_ * fVar199;
            local_7d0._8_4_ = auVar70._8_4_ * fVar199;
            local_7d0._12_4_ = auVar70._12_4_ * fVar199;
            auVar76 = vdpps_avx(local_900._0_16_,local_7d0,0x7f);
            fVar202 = auVar71._0_4_;
            auVar132._0_4_ = auVar76._0_4_ * auVar76._0_4_;
            auVar132._4_4_ = auVar76._4_4_ * auVar76._4_4_;
            auVar132._8_4_ = auVar76._8_4_ * auVar76._8_4_;
            auVar132._12_4_ = auVar76._12_4_ * auVar76._12_4_;
            auVar72 = vsubps_avx512vl(local_6e0._0_16_,auVar132);
            fVar200 = auVar72._0_4_;
            auVar146._4_12_ = ZEXT812(0) << 0x20;
            auVar146._0_4_ = fVar200;
            auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar146);
            auVar74 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
            if (fVar200 < 0.0) {
              local_7e0 = auVar76;
              local_4f0 = fVar199;
              fStack_4ec = fVar199;
              fStack_4e8 = fVar199;
              fStack_4e4 = fVar199;
              local_4e0 = auVar73;
              fVar200 = sqrtf(fVar200);
              auVar74 = ZEXT416(auVar74._0_4_);
              auVar71 = ZEXT416((uint)local_680._0_4_);
              uVar65 = extraout_RAX_01;
              auVar72 = local_4e0;
              auVar237 = local_900._0_16_;
              auVar70 = _local_660;
              auVar76 = local_7e0;
              fVar199 = local_4f0;
              fVar203 = fStack_4ec;
              fVar204 = fStack_4e8;
              fVar223 = fStack_4e4;
            }
            else {
              auVar72 = vsqrtss_avx(auVar72,auVar72);
              fVar200 = auVar72._0_4_;
              auVar72 = auVar73;
              auVar237 = local_900._0_16_;
              fVar203 = fVar199;
              fVar204 = fVar199;
              fVar223 = fVar199;
            }
            auVar247 = ZEXT1664(auVar237);
            auVar259 = ZEXT3264(local_700);
            auVar262 = ZEXT3264(local_720);
            auVar254 = ZEXT3264(local_800);
            auVar255 = ZEXT3264(local_820);
            auVar256 = ZEXT3264(local_840);
            auVar257 = ZEXT3264(local_860);
            auVar258 = ZEXT3264(local_880);
            auVar260 = ZEXT3264(local_8a0);
            auVar261 = ZEXT3264(local_740);
            auVar263 = ZEXT3264(local_760);
            auVar264 = ZEXT3264(local_780);
            auVar265 = ZEXT3264(local_7a0);
            auVar147._0_4_ = (float)local_4c0._0_4_ * (float)local_5e0._0_4_;
            auVar147._4_4_ = (float)local_4c0._0_4_ * (float)local_5e0._4_4_;
            auVar147._8_4_ = (float)local_4c0._0_4_ * fStack_5d8;
            auVar147._12_4_ = (float)local_4c0._0_4_ * fStack_5d4;
            auVar165._4_4_ = local_4a0._0_4_;
            auVar165._0_4_ = local_4a0._0_4_;
            auVar165._8_4_ = local_4a0._0_4_;
            auVar165._12_4_ = local_4a0._0_4_;
            auVar12 = vfmadd132ps_fma(auVar165,auVar147,local_5a0._0_16_);
            auVar148._4_4_ = local_480._0_4_;
            auVar148._0_4_ = local_480._0_4_;
            auVar148._8_4_ = local_480._0_4_;
            auVar148._12_4_ = local_480._0_4_;
            auVar12 = vfmadd132ps_fma(auVar148,auVar12,local_5c0._0_16_);
            auVar13 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                      ZEXT416(0x40000000));
            uVar126 = auVar13._0_4_;
            auVar166._4_4_ = uVar126;
            auVar166._0_4_ = uVar126;
            auVar166._8_4_ = uVar126;
            auVar166._12_4_ = uVar126;
            auVar12 = vfmadd132ps_fma(auVar166,auVar12,local_580._0_16_);
            auVar149._0_4_ = auVar12._0_4_ * (float)local_600._0_4_;
            auVar149._4_4_ = auVar12._4_4_ * (float)local_600._0_4_;
            auVar149._8_4_ = auVar12._8_4_ * (float)local_600._0_4_;
            auVar149._12_4_ = auVar12._12_4_ * (float)local_600._0_4_;
            auVar12 = vdpps_avx(auVar70,auVar12,0x7f);
            fVar160 = auVar12._0_4_;
            auVar167._0_4_ = auVar70._0_4_ * fVar160;
            auVar167._4_4_ = auVar70._4_4_ * fVar160;
            auVar167._8_4_ = auVar70._8_4_ * fVar160;
            auVar167._12_4_ = auVar70._12_4_ * fVar160;
            auVar13 = vsubps_avx(auVar149,auVar167);
            fVar160 = auVar69._0_4_ * (float)local_7c0._0_4_;
            auVar12 = vmaxss_avx(ZEXT416((uint)fVar178),
                                 ZEXT416((uint)(local_560._0_4_ * fVar205 * 1.9073486e-06)));
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar116._16_16_ = local_7a0._16_16_;
            auVar75 = vxorps_avx512vl(auVar70,auVar21);
            auVar168._0_4_ = fVar199 * auVar13._0_4_ * fVar160;
            auVar168._4_4_ = fVar203 * auVar13._4_4_ * fVar160;
            auVar168._8_4_ = fVar204 * auVar13._8_4_ * fVar160;
            auVar168._12_4_ = fVar223 * auVar13._12_4_ * fVar160;
            auVar69 = vdpps_avx(auVar75,local_7d0,0x7f);
            auVar13 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar178),auVar12);
            auVar71 = vdpps_avx(auVar237,auVar168,0x7f);
            auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar202 + 1.0)),
                                      ZEXT416((uint)(fVar178 / fVar201)),auVar13);
            fVar199 = auVar69._0_4_ + auVar71._0_4_;
            auVar71 = vdpps_avx(local_540._0_16_,local_7d0,0x7f);
            auVar69 = vdpps_avx(auVar237,auVar75,0x7f);
            auVar74 = vmulss_avx512f(auVar74,auVar72);
            fVar201 = auVar73._0_4_ * 1.5 + auVar74._0_4_ * auVar72._0_4_ * auVar72._0_4_;
            auVar72 = vdpps_avx(auVar237,local_540._0_16_,0x7f);
            auVar74 = vfnmadd231ss_fma(auVar69,auVar76,ZEXT416((uint)fVar199));
            auVar72 = vfnmadd231ss_fma(auVar72,auVar76,auVar71);
            auVar69 = vpermilps_avx(local_460._0_16_,0xff);
            fVar200 = fVar200 - auVar69._0_4_;
            auVar73 = vshufps_avx(auVar70,auVar70,0xff);
            auVar69 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar201),auVar73);
            auVar238._8_4_ = 0x80000000;
            auVar238._0_8_ = 0x8000000080000000;
            auVar238._12_4_ = 0x80000000;
            auVar240 = ZEXT1664(auVar238);
            auVar229._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
            auVar229._8_4_ = auVar69._8_4_ ^ 0x80000000;
            auVar229._12_4_ = auVar69._12_4_ ^ 0x80000000;
            auVar233 = ZEXT1664(auVar229);
            auVar72 = ZEXT416((uint)(auVar72._0_4_ * fVar201));
            auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar69._0_4_)),
                                      ZEXT416((uint)fVar199),auVar72);
            auVar69 = vinsertps_avx(auVar229,auVar72,0x1c);
            auVar217._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
            auVar217._8_4_ = auVar71._8_4_ ^ 0x80000000;
            auVar217._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar72 = vinsertps_avx(ZEXT416((uint)fVar199),auVar217,0x10);
            auVar185._0_4_ = auVar74._0_4_;
            auVar185._4_4_ = auVar185._0_4_;
            auVar185._8_4_ = auVar185._0_4_;
            auVar185._12_4_ = auVar185._0_4_;
            auVar71 = vdivps_avx(auVar69,auVar185);
            auVar69 = vdivps_avx(auVar72,auVar185);
            fVar199 = auVar76._0_4_;
            auVar186._0_4_ = fVar199 * auVar71._0_4_ + fVar200 * auVar69._0_4_;
            auVar186._4_4_ = fVar199 * auVar71._4_4_ + fVar200 * auVar69._4_4_;
            auVar186._8_4_ = fVar199 * auVar71._8_4_ + fVar200 * auVar69._8_4_;
            auVar186._12_4_ = fVar199 * auVar71._12_4_ + fVar200 * auVar69._12_4_;
            auVar71 = vsubps_avx(local_560._0_16_,auVar186);
            auVar22._8_4_ = 0x7fffffff;
            auVar22._0_8_ = 0x7fffffff7fffffff;
            auVar22._12_4_ = 0x7fffffff;
            auVar69 = vandps_avx512vl(auVar76,auVar22);
            if (auVar69._0_4_ < auVar13._0_4_) {
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_)),local_500,
                                        ZEXT416(0x36000000));
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(ZEXT416((uint)fVar200),auVar23);
              if (auVar76._0_4_ < auVar69._0_4_) {
                bVar64 = uVar63 < 5;
                fVar205 = auVar71._0_4_ + (float)local_510._0_4_;
                bVar57 = 0;
                if ((fVar205 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar205))
                goto LAB_017eb6ad;
                auVar71 = vmovshdup_avx(auVar71);
                fVar178 = auVar71._0_4_;
                bVar57 = 0;
                if ((fVar178 < 0.0) || (bVar57 = 0, 1.0 < fVar178)) goto LAB_017eb6ad;
                auVar49._12_4_ = 0;
                auVar49._0_12_ = ZEXT412(0);
                auVar116._4_12_ = ZEXT412(0);
                auVar116._0_4_ = local_6e0._0_4_;
                auVar71 = vrsqrt14ss_avx512f(auVar49 << 0x20,auVar116._0_16_);
                fVar199 = auVar71._0_4_;
                auVar71 = vmulss_avx512f(local_6e0._0_16_,ZEXT416(0xbf000000));
                pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_017eb6ad;
                  local_8c0._0_4_ = ray->tfar;
                  fVar199 = fVar199 * 1.5 + auVar71._0_4_ * fVar199 * fVar199 * fVar199;
                  auVar187._0_4_ = auVar237._0_4_ * fVar199;
                  auVar187._4_4_ = auVar237._4_4_ * fVar199;
                  auVar187._8_4_ = auVar237._8_4_ * fVar199;
                  auVar187._12_4_ = auVar237._12_4_ * fVar199;
                  auVar76 = vfmadd213ps_fma(auVar73,auVar187,auVar70);
                  auVar71 = vshufps_avx(auVar187,auVar187,0xc9);
                  auVar69 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar188._0_4_ = auVar187._0_4_ * auVar69._0_4_;
                  auVar188._4_4_ = auVar187._4_4_ * auVar69._4_4_;
                  auVar188._8_4_ = auVar187._8_4_ * auVar69._8_4_;
                  auVar188._12_4_ = auVar187._12_4_ * auVar69._12_4_;
                  auVar70 = vfmsub231ps_fma(auVar188,auVar70,auVar71);
                  auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar69 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                  auVar133._0_4_ = auVar76._0_4_ * auVar70._0_4_;
                  auVar133._4_4_ = auVar76._4_4_ * auVar70._4_4_;
                  auVar133._8_4_ = auVar76._8_4_ * auVar70._8_4_;
                  auVar133._12_4_ = auVar76._12_4_ * auVar70._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar133,auVar71,auVar69);
                  auVar71 = vshufps_avx(auVar69,auVar69,0xe9);
                  local_640 = vmovlps_avx(auVar71);
                  local_638 = auVar69._0_4_;
                  local_630 = 0;
                  local_62c = (undefined4)local_8d0;
                  local_628 = (undefined4)local_8c8;
                  local_624 = context->user->instID[0];
                  local_620 = context->user->instPrimID[0];
                  ray->tfar = fVar205;
                  local_904 = -1;
                  local_6b0.valid = &local_904;
                  local_6b0.geometryUserPtr = pGVar3->userPtr;
                  local_6b0.context = context->user;
                  local_6b0.hit = (RTCHitN *)&local_640;
                  local_6b0.N = 1;
                  local_900._0_8_ = pGVar3;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_634 = fVar178;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017eb90c:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_900._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar233 = ZEXT1664(auVar233._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      (*p_Var4)(&local_6b0);
                      auVar265 = ZEXT3264(local_7a0);
                      auVar264 = ZEXT3264(local_780);
                      auVar263 = ZEXT3264(local_760);
                      auVar261 = ZEXT3264(local_740);
                      auVar260 = ZEXT3264(local_8a0);
                      auVar258 = ZEXT3264(local_880);
                      auVar257 = ZEXT3264(local_860);
                      auVar256 = ZEXT3264(local_840);
                      auVar255 = ZEXT3264(local_820);
                      auVar254 = ZEXT3264(local_800);
                      auVar262 = ZEXT3264(local_720);
                      auVar259 = ZEXT3264(local_700);
                      if (*local_6b0.valid == 0) goto LAB_017eb9b3;
                    }
                    bVar57 = 1;
                    goto LAB_017eb6ad;
                  }
                  auVar233 = ZEXT1664(auVar229);
                  auVar240 = ZEXT1664(auVar238);
                  auVar247 = ZEXT1664(auVar237);
                  (*pGVar3->occlusionFilterN)(&local_6b0);
                  auVar265 = ZEXT3264(local_7a0);
                  auVar264 = ZEXT3264(local_780);
                  auVar263 = ZEXT3264(local_760);
                  auVar261 = ZEXT3264(local_740);
                  auVar260 = ZEXT3264(local_8a0);
                  auVar258 = ZEXT3264(local_880);
                  auVar257 = ZEXT3264(local_860);
                  auVar256 = ZEXT3264(local_840);
                  auVar255 = ZEXT3264(local_820);
                  auVar254 = ZEXT3264(local_800);
                  auVar262 = ZEXT3264(local_720);
                  auVar259 = ZEXT3264(local_700);
                  if (*local_6b0.valid != 0) goto LAB_017eb90c;
LAB_017eb9b3:
                  ray->tfar = (float)local_8c0._0_4_;
                }
                bVar57 = 0;
                goto LAB_017eb6ad;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar64 = false;
LAB_017eb6ad:
          bVar62 = bVar62 | bVar64 & bVar57;
          auVar54._4_4_ = fStack_3bc;
          auVar54._0_4_ = local_3c0;
          auVar54._8_4_ = fStack_3b8;
          auVar54._12_4_ = fStack_3b4;
          auVar54._16_4_ = fStack_3b0;
          auVar54._20_4_ = fStack_3ac;
          auVar54._24_4_ = fStack_3a8;
          auVar54._28_4_ = fStack_3a4;
          fVar205 = ray->tfar;
          auVar33._4_4_ = fVar205;
          auVar33._0_4_ = fVar205;
          auVar33._8_4_ = fVar205;
          auVar33._12_4_ = fVar205;
          auVar33._16_4_ = fVar205;
          auVar33._20_4_ = fVar205;
          auVar33._24_4_ = fVar205;
          auVar33._28_4_ = fVar205;
          uVar14 = vcmpps_avx512vl(auVar54,auVar33,2);
        }
        auVar158._0_4_ = (float)local_400._0_4_ + (float)local_3e0._0_4_;
        auVar158._4_4_ = (float)local_400._4_4_ + (float)local_3e0._4_4_;
        auVar158._8_4_ = fStack_3f8 + fStack_3d8;
        auVar158._12_4_ = fStack_3f4 + fStack_3d4;
        auVar158._16_4_ = fStack_3f0 + fStack_3d0;
        auVar158._20_4_ = fStack_3ec + fStack_3cc;
        auVar158._24_4_ = fStack_3e8 + fStack_3c8;
        auVar158._28_4_ = fStack_3e4 + fStack_3c4;
        fVar178 = ray->tfar;
        fVar205 = ray->tfar;
        auVar34._4_4_ = fVar205;
        auVar34._0_4_ = fVar205;
        auVar34._8_4_ = fVar205;
        auVar34._12_4_ = fVar205;
        auVar34._16_4_ = fVar205;
        auVar34._20_4_ = fVar205;
        auVar34._24_4_ = fVar205;
        auVar34._28_4_ = fVar205;
        uVar14 = vcmpps_avx512vl(auVar158,auVar34,2);
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar159,auVar35);
        bVar64 = (bool)((byte)local_7a8 & 1);
        local_3e0._0_4_ = (uint)bVar64 * auVar77._0_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)((byte)(local_7a8 >> 1) & 1);
        local_3e0._4_4_ = (uint)bVar64 * auVar77._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)((byte)(local_7a8 >> 2) & 1);
        fStack_3d8 = (float)((uint)bVar64 * auVar77._8_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)((byte)(local_7a8 >> 3) & 1);
        fStack_3d4 = (float)((uint)bVar64 * auVar77._12_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)((byte)(local_7a8 >> 4) & 1);
        fStack_3d0 = (float)((uint)bVar64 * auVar77._16_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)((byte)(local_7a8 >> 5) & 1);
        fStack_3cc = (float)((uint)bVar64 * auVar77._20_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)((byte)(local_7a8 >> 6) & 1);
        fStack_3c8 = (float)((uint)bVar64 * auVar77._24_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)((byte)(local_7a8 >> 7) & 1);
        fStack_3c4 = (float)((uint)bVar64 * auVar77._28_4_ | (uint)!bVar64 * 2);
        bVar56 = (byte)uVar15 & bVar56 & (byte)uVar14;
        uVar14 = vpcmpd_avx512vl(_local_3e0,local_380,2);
        local_420 = _local_360;
        local_3c0 = (float)local_400._0_4_ + (float)local_360._0_4_;
        fStack_3bc = (float)local_400._4_4_ + (float)local_360._4_4_;
        fStack_3b8 = fStack_3f8 + fStack_358;
        fStack_3b4 = fStack_3f4 + fStack_354;
        fStack_3b0 = fStack_3f0 + fStack_350;
        fStack_3ac = fStack_3ec + fStack_34c;
        fStack_3a8 = fStack_3e8 + fStack_348;
        fStack_3a4 = fStack_3e4 + fStack_344;
        for (bVar59 = (byte)uVar14 & bVar56; auVar77 = local_8c0, bVar59 != 0;
            bVar59 = ~bVar60 & bVar59 & (byte)uVar14) {
          auVar142._8_4_ = 0x7f800000;
          auVar142._0_8_ = 0x7f8000007f800000;
          auVar142._12_4_ = 0x7f800000;
          auVar142._16_4_ = 0x7f800000;
          auVar142._20_4_ = 0x7f800000;
          auVar142._24_4_ = 0x7f800000;
          auVar142._28_4_ = 0x7f800000;
          auVar80 = vblendmps_avx512vl(auVar142,local_420);
          auVar117._0_4_ =
               (uint)(bVar59 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
          bVar64 = (bool)(bVar59 >> 1 & 1);
          auVar117._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar59 >> 2 & 1);
          auVar117._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar59 >> 3 & 1);
          auVar117._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar59 >> 4 & 1);
          auVar117._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar59 >> 5 & 1);
          auVar117._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar59 >> 6 & 1);
          auVar117._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 0x7f800000;
          auVar117._28_4_ =
               (uint)(bVar59 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
          auVar80 = vshufps_avx(auVar117,auVar117,0xb1);
          auVar80 = vminps_avx(auVar117,auVar80);
          auVar81 = vshufpd_avx(auVar80,auVar80,5);
          auVar80 = vminps_avx(auVar80,auVar81);
          auVar81 = vpermpd_avx2(auVar80,0x4e);
          auVar80 = vminps_avx(auVar80,auVar81);
          uVar14 = vcmpps_avx512vl(auVar117,auVar80,0);
          bVar57 = (byte)uVar14 & bVar59;
          bVar60 = bVar59;
          if (bVar57 != 0) {
            bVar60 = bVar57;
          }
          iVar17 = 0;
          for (uVar66 = (uint)bVar60; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar60 = '\x01' << ((byte)iVar17 & 0x1f);
          auVar233 = ZEXT464(*(uint *)(local_340 + (uint)(iVar17 << 2)));
          aVar1 = (ray->dir).field_0;
          local_540._0_16_ = (undefined1  [16])aVar1;
          auVar71 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar71._0_4_ < 0.0) {
            local_8c0[1] = 0;
            local_8c0[0] = bVar59;
            local_8c0._2_30_ = auVar77._2_30_;
            local_900._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
            local_6e0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar17 << 2)));
            auVar240 = ZEXT1664(auVar240._0_16_);
            auVar247 = ZEXT1664(auVar247._0_16_);
            fVar205 = sqrtf(auVar71._0_4_);
            auVar233 = ZEXT1664(local_6e0._0_16_);
            bVar59 = local_8c0[0];
            auVar265 = ZEXT3264(local_7a0);
            auVar264 = ZEXT3264(local_780);
            auVar263 = ZEXT3264(local_760);
            auVar261 = ZEXT3264(local_740);
            auVar260 = ZEXT3264(local_8a0);
            auVar258 = ZEXT3264(local_880);
            auVar257 = ZEXT3264(local_860);
            auVar256 = ZEXT3264(local_840);
            auVar255 = ZEXT3264(local_820);
            auVar254 = ZEXT3264(local_800);
            auVar262 = ZEXT3264(local_720);
            auVar259 = ZEXT3264(local_700);
            auVar71 = local_900._0_16_;
          }
          else {
            auVar71 = vsqrtss_avx(auVar71,auVar71);
            fVar205 = auVar71._0_4_;
            auVar71 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
          }
          uVar65 = (ulong)bVar60;
          auVar70 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar69 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar76 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar72 = vminps_avx(auVar70,auVar76);
          auVar70 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar76 = vmaxps_avx(auVar69,auVar70);
          auVar189._8_4_ = 0x7fffffff;
          auVar189._0_8_ = 0x7fffffff7fffffff;
          auVar189._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar72,auVar189);
          auVar70 = vandps_avx(auVar76,auVar189);
          auVar69 = vmaxps_avx(auVar69,auVar70);
          auVar70 = vmovshdup_avx(auVar69);
          auVar70 = vmaxss_avx(auVar70,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar70);
          fVar178 = auVar69._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar76,auVar76,0xff);
          auVar71 = vinsertps_avx(auVar233._0_16_,auVar71,0x10);
          uVar63 = 0;
          while( true ) {
            bVar57 = (byte)uVar65;
            if (uVar63 == 5) break;
            uVar126 = auVar71._0_4_;
            auVar134._4_4_ = uVar126;
            auVar134._0_4_ = uVar126;
            auVar134._8_4_ = uVar126;
            auVar134._12_4_ = uVar126;
            auVar70 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_540._0_16_);
            auVar69 = vmovshdup_avx(auVar71);
            fVar203 = auVar69._0_4_;
            fVar204 = 1.0 - fVar203;
            fVar199 = fVar203 * fVar203;
            auVar237 = SUB6416(ZEXT464(0x40400000),0);
            auVar74 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar72 = vfmadd213ss_fma(auVar237,auVar69,auVar74);
            auVar76 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar199),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar73 = vfmadd213ss_fma(auVar237,ZEXT416((uint)fVar204),auVar74);
            auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)(fVar204 * fVar204)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar200 = fVar204 * fVar204 * -fVar203 * 0.5;
            fVar201 = auVar76._0_4_ * 0.5;
            fVar202 = auVar73._0_4_ * 0.5;
            fVar203 = fVar203 * fVar203 * -fVar204 * 0.5;
            auVar190._0_4_ = fVar203 * (float)local_5e0._0_4_;
            auVar190._4_4_ = fVar203 * (float)local_5e0._4_4_;
            auVar190._8_4_ = fVar203 * fStack_5d8;
            auVar190._12_4_ = fVar203 * fStack_5d4;
            auVar209._4_4_ = fVar202;
            auVar209._0_4_ = fVar202;
            auVar209._8_4_ = fVar202;
            auVar209._12_4_ = fVar202;
            auVar76 = vfmadd132ps_fma(auVar209,auVar190,local_5a0._0_16_);
            auVar169._4_4_ = fVar201;
            auVar169._0_4_ = fVar201;
            auVar169._8_4_ = fVar201;
            auVar169._12_4_ = fVar201;
            auVar76 = vfmadd132ps_fma(auVar169,auVar76,local_5c0._0_16_);
            auVar191._4_4_ = fVar200;
            auVar191._0_4_ = fVar200;
            auVar191._8_4_ = fVar200;
            auVar191._12_4_ = fVar200;
            auVar76 = vfmadd132ps_fma(auVar191,auVar76,local_580._0_16_);
            auVar73 = vfmadd231ss_fma(auVar74,auVar69,ZEXT416(0x41100000));
            local_480._0_16_ = auVar73;
            auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar69,ZEXT416(0x40800000));
            local_4a0._0_16_ = auVar73;
            local_8c0._0_16_ = auVar69;
            auVar69 = vfmadd213ss_fma(auVar237,auVar69,ZEXT416(0xbf800000));
            local_4c0._0_16_ = auVar69;
            local_460._0_16_ = auVar76;
            auVar69 = vsubps_avx(auVar70,auVar76);
            local_900._0_16_ = auVar69;
            auVar69 = vdpps_avx(auVar69,auVar69,0x7f);
            local_6e0._0_16_ = auVar69;
            local_560._0_16_ = auVar71;
            if (auVar69._0_4_ < 0.0) {
              local_660._0_4_ = auVar72._0_4_;
              local_680._0_16_ = ZEXT416((uint)fVar204);
              local_600._0_4_ = fVar199;
              local_7c0._0_4_ = fVar204 * -2.0;
              auVar240._0_4_ = sqrtf(auVar69._0_4_);
              auVar240._4_60_ = extraout_var_00;
              auVar72 = ZEXT416((uint)local_660._0_4_);
              auVar71 = auVar240._0_16_;
              uVar65 = extraout_RAX_02;
              auVar69 = local_680._0_16_;
            }
            else {
              auVar71 = vsqrtss_avx(auVar69,auVar69);
              local_7c0._0_4_ = fVar204 * -2.0;
              local_600._0_4_ = fVar199;
              auVar69 = ZEXT416((uint)fVar204);
            }
            fVar200 = auVar69._0_4_;
            fVar199 = local_8c0._0_4_;
            auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar199 * (fVar200 + fVar200))),auVar69,
                                       auVar69);
            auVar69 = vfmadd213ss_fma(auVar72,ZEXT416((uint)(fVar199 + fVar199)),
                                      ZEXT416((uint)(fVar199 * fVar199 * 3.0)));
            auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8c0._0_16_,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * fVar200 * -3.0)),
                                      ZEXT416((uint)(fVar200 + fVar200)),auVar70);
            auVar70 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),local_8c0._0_16_,
                                      ZEXT416((uint)local_600._0_4_));
            fVar199 = auVar73._0_4_ * 0.5;
            fVar200 = auVar69._0_4_ * 0.5;
            fVar201 = auVar76._0_4_ * 0.5;
            fVar202 = auVar70._0_4_ * 0.5;
            auVar192._0_4_ = fVar202 * (float)local_5e0._0_4_;
            auVar192._4_4_ = fVar202 * (float)local_5e0._4_4_;
            auVar192._8_4_ = fVar202 * fStack_5d8;
            auVar192._12_4_ = fVar202 * fStack_5d4;
            auVar170._4_4_ = fVar201;
            auVar170._0_4_ = fVar201;
            auVar170._8_4_ = fVar201;
            auVar170._12_4_ = fVar201;
            auVar69 = vfmadd132ps_fma(auVar170,auVar192,local_5a0._0_16_);
            auVar150._4_4_ = fVar200;
            auVar150._0_4_ = fVar200;
            auVar150._8_4_ = fVar200;
            auVar150._12_4_ = fVar200;
            auVar69 = vfmadd132ps_fma(auVar150,auVar69,local_5c0._0_16_);
            auVar251._4_4_ = fVar199;
            auVar251._0_4_ = fVar199;
            auVar251._8_4_ = fVar199;
            auVar251._12_4_ = fVar199;
            _local_660 = vfmadd132ps_fma(auVar251,auVar69,local_580._0_16_);
            local_600._0_16_ = vdpps_avx(_local_660,_local_660,0x7f);
            auVar50._12_4_ = 0;
            auVar50._0_12_ = ZEXT812(0);
            fVar199 = local_600._0_4_;
            local_7d0 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar199));
            fVar200 = local_7d0._0_4_;
            local_7c0 = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar199));
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar70 = vxorps_avx512vl(local_600._0_16_,auVar24);
            auVar69 = vfnmadd213ss_fma(local_7c0,local_600._0_16_,SUB6416(ZEXT464(0x40000000),0));
            local_680._0_4_ = auVar71._0_4_;
            if (fVar199 < auVar70._0_4_) {
              local_7e0._0_4_ = fVar199 * -0.5;
              fVar201 = sqrtf(fVar199);
              auVar71 = ZEXT416((uint)local_680._0_4_);
              uVar65 = extraout_RAX_03;
              fVar199 = (float)local_7e0._0_4_;
              auVar70 = _local_660;
            }
            else {
              auVar70 = vsqrtss_avx(local_600._0_16_,local_600._0_16_);
              fVar201 = auVar70._0_4_;
              fVar199 = fVar199 * -0.5;
              auVar70 = _local_660;
            }
            fVar202 = local_7d0._0_4_;
            fVar199 = fVar200 * 1.5 + fVar199 * fVar202 * fVar202 * fVar202;
            local_7d0._0_4_ = auVar70._0_4_ * fVar199;
            local_7d0._4_4_ = auVar70._4_4_ * fVar199;
            local_7d0._8_4_ = auVar70._8_4_ * fVar199;
            local_7d0._12_4_ = auVar70._12_4_ * fVar199;
            auVar76 = vdpps_avx(local_900._0_16_,local_7d0,0x7f);
            fVar202 = auVar71._0_4_;
            auVar135._0_4_ = auVar76._0_4_ * auVar76._0_4_;
            auVar135._4_4_ = auVar76._4_4_ * auVar76._4_4_;
            auVar135._8_4_ = auVar76._8_4_ * auVar76._8_4_;
            auVar135._12_4_ = auVar76._12_4_ * auVar76._12_4_;
            auVar72 = vsubps_avx512vl(local_6e0._0_16_,auVar135);
            fVar200 = auVar72._0_4_;
            auVar151._4_12_ = ZEXT812(0) << 0x20;
            auVar151._0_4_ = fVar200;
            auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
            auVar74 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
            if (fVar200 < 0.0) {
              local_7e0 = auVar76;
              local_4f0 = fVar199;
              fStack_4ec = fVar199;
              fStack_4e8 = fVar199;
              fStack_4e4 = fVar199;
              local_4e0 = auVar73;
              fVar200 = sqrtf(fVar200);
              auVar74 = ZEXT416(auVar74._0_4_);
              auVar71 = ZEXT416((uint)local_680._0_4_);
              uVar65 = extraout_RAX_04;
              auVar72 = local_4e0;
              auVar237 = local_900._0_16_;
              auVar70 = _local_660;
              auVar76 = local_7e0;
              fVar199 = local_4f0;
              fVar203 = fStack_4ec;
              fVar204 = fStack_4e8;
              fVar223 = fStack_4e4;
            }
            else {
              auVar72 = vsqrtss_avx(auVar72,auVar72);
              fVar200 = auVar72._0_4_;
              auVar72 = auVar73;
              auVar237 = local_900._0_16_;
              fVar203 = fVar199;
              fVar204 = fVar199;
              fVar223 = fVar199;
            }
            auVar247 = ZEXT1664(auVar237);
            auVar259 = ZEXT3264(local_700);
            auVar262 = ZEXT3264(local_720);
            auVar254 = ZEXT3264(local_800);
            auVar255 = ZEXT3264(local_820);
            auVar256 = ZEXT3264(local_840);
            auVar257 = ZEXT3264(local_860);
            auVar258 = ZEXT3264(local_880);
            auVar260 = ZEXT3264(local_8a0);
            auVar261 = ZEXT3264(local_740);
            auVar263 = ZEXT3264(local_760);
            auVar264 = ZEXT3264(local_780);
            auVar265 = ZEXT3264(local_7a0);
            auVar152._0_4_ = (float)local_4c0._0_4_ * (float)local_5e0._0_4_;
            auVar152._4_4_ = (float)local_4c0._0_4_ * (float)local_5e0._4_4_;
            auVar152._8_4_ = (float)local_4c0._0_4_ * fStack_5d8;
            auVar152._12_4_ = (float)local_4c0._0_4_ * fStack_5d4;
            auVar171._4_4_ = local_4a0._0_4_;
            auVar171._0_4_ = local_4a0._0_4_;
            auVar171._8_4_ = local_4a0._0_4_;
            auVar171._12_4_ = local_4a0._0_4_;
            auVar12 = vfmadd132ps_fma(auVar171,auVar152,local_5a0._0_16_);
            auVar153._4_4_ = local_480._0_4_;
            auVar153._0_4_ = local_480._0_4_;
            auVar153._8_4_ = local_480._0_4_;
            auVar153._12_4_ = local_480._0_4_;
            auVar12 = vfmadd132ps_fma(auVar153,auVar12,local_5c0._0_16_);
            auVar13 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                      ZEXT416(0x40000000));
            uVar126 = auVar13._0_4_;
            auVar172._4_4_ = uVar126;
            auVar172._0_4_ = uVar126;
            auVar172._8_4_ = uVar126;
            auVar172._12_4_ = uVar126;
            auVar12 = vfmadd132ps_fma(auVar172,auVar12,local_580._0_16_);
            auVar154._0_4_ = auVar12._0_4_ * (float)local_600._0_4_;
            auVar154._4_4_ = auVar12._4_4_ * (float)local_600._0_4_;
            auVar154._8_4_ = auVar12._8_4_ * (float)local_600._0_4_;
            auVar154._12_4_ = auVar12._12_4_ * (float)local_600._0_4_;
            auVar12 = vdpps_avx(auVar70,auVar12,0x7f);
            fVar160 = auVar12._0_4_;
            auVar173._0_4_ = auVar70._0_4_ * fVar160;
            auVar173._4_4_ = auVar70._4_4_ * fVar160;
            auVar173._8_4_ = auVar70._8_4_ * fVar160;
            auVar173._12_4_ = auVar70._12_4_ * fVar160;
            auVar13 = vsubps_avx(auVar154,auVar173);
            fVar160 = auVar69._0_4_ * (float)local_7c0._0_4_;
            auVar12 = vmaxss_avx(ZEXT416((uint)fVar178),
                                 ZEXT416((uint)(local_560._0_4_ * fVar205 * 1.9073486e-06)));
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar118._16_16_ = local_7a0._16_16_;
            auVar75 = vxorps_avx512vl(auVar70,auVar25);
            auVar174._0_4_ = fVar199 * auVar13._0_4_ * fVar160;
            auVar174._4_4_ = fVar203 * auVar13._4_4_ * fVar160;
            auVar174._8_4_ = fVar204 * auVar13._8_4_ * fVar160;
            auVar174._12_4_ = fVar223 * auVar13._12_4_ * fVar160;
            auVar69 = vdpps_avx(auVar75,local_7d0,0x7f);
            auVar13 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar178),auVar12);
            auVar71 = vdpps_avx(auVar237,auVar174,0x7f);
            auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar202 + 1.0)),
                                      ZEXT416((uint)(fVar178 / fVar201)),auVar13);
            fVar199 = auVar69._0_4_ + auVar71._0_4_;
            auVar71 = vdpps_avx(local_540._0_16_,local_7d0,0x7f);
            auVar69 = vdpps_avx(auVar237,auVar75,0x7f);
            auVar74 = vmulss_avx512f(auVar74,auVar72);
            fVar201 = auVar73._0_4_ * 1.5 + auVar74._0_4_ * auVar72._0_4_ * auVar72._0_4_;
            auVar72 = vdpps_avx(auVar237,local_540._0_16_,0x7f);
            auVar74 = vfnmadd231ss_fma(auVar69,auVar76,ZEXT416((uint)fVar199));
            auVar72 = vfnmadd231ss_fma(auVar72,auVar76,auVar71);
            auVar69 = vpermilps_avx(local_460._0_16_,0xff);
            fVar200 = fVar200 - auVar69._0_4_;
            auVar73 = vshufps_avx(auVar70,auVar70,0xff);
            auVar69 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar201),auVar73);
            auVar239._8_4_ = 0x80000000;
            auVar239._0_8_ = 0x8000000080000000;
            auVar239._12_4_ = 0x80000000;
            auVar240 = ZEXT1664(auVar239);
            auVar230._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
            auVar230._8_4_ = auVar69._8_4_ ^ 0x80000000;
            auVar230._12_4_ = auVar69._12_4_ ^ 0x80000000;
            auVar233 = ZEXT1664(auVar230);
            auVar72 = ZEXT416((uint)(auVar72._0_4_ * fVar201));
            auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar69._0_4_)),
                                      ZEXT416((uint)fVar199),auVar72);
            auVar69 = vinsertps_avx(auVar230,auVar72,0x1c);
            auVar218._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
            auVar218._8_4_ = auVar71._8_4_ ^ 0x80000000;
            auVar218._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar72 = vinsertps_avx(ZEXT416((uint)fVar199),auVar218,0x10);
            auVar193._0_4_ = auVar74._0_4_;
            auVar193._4_4_ = auVar193._0_4_;
            auVar193._8_4_ = auVar193._0_4_;
            auVar193._12_4_ = auVar193._0_4_;
            auVar71 = vdivps_avx(auVar69,auVar193);
            auVar69 = vdivps_avx(auVar72,auVar193);
            fVar199 = auVar76._0_4_;
            auVar194._0_4_ = fVar199 * auVar71._0_4_ + fVar200 * auVar69._0_4_;
            auVar194._4_4_ = fVar199 * auVar71._4_4_ + fVar200 * auVar69._4_4_;
            auVar194._8_4_ = fVar199 * auVar71._8_4_ + fVar200 * auVar69._8_4_;
            auVar194._12_4_ = fVar199 * auVar71._12_4_ + fVar200 * auVar69._12_4_;
            auVar71 = vsubps_avx(local_560._0_16_,auVar194);
            auVar26._8_4_ = 0x7fffffff;
            auVar26._0_8_ = 0x7fffffff7fffffff;
            auVar26._12_4_ = 0x7fffffff;
            auVar69 = vandps_avx512vl(auVar76,auVar26);
            if (auVar69._0_4_ < auVar13._0_4_) {
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_)),local_500,
                                        ZEXT416(0x36000000));
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(ZEXT416((uint)fVar200),auVar27);
              if (auVar76._0_4_ < auVar69._0_4_) {
                bVar64 = uVar63 < 5;
                fVar205 = auVar71._0_4_ + (float)local_510._0_4_;
                bVar57 = 0;
                if ((fVar205 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar205))
                goto LAB_017ec28c;
                auVar71 = vmovshdup_avx(auVar71);
                fVar178 = auVar71._0_4_;
                bVar57 = 0;
                if ((fVar178 < 0.0) || (bVar57 = 0, 1.0 < fVar178)) goto LAB_017ec28c;
                auVar51._12_4_ = 0;
                auVar51._0_12_ = ZEXT412(0);
                auVar118._4_12_ = ZEXT412(0);
                auVar118._0_4_ = local_6e0._0_4_;
                auVar71 = vrsqrt14ss_avx512f(auVar51 << 0x20,auVar118._0_16_);
                fVar199 = auVar71._0_4_;
                auVar71 = vmulss_avx512f(local_6e0._0_16_,ZEXT416(0xbf000000));
                pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_017ec28c;
                  local_8c0._0_4_ = ray->tfar;
                  fVar199 = fVar199 * 1.5 + auVar71._0_4_ * fVar199 * fVar199 * fVar199;
                  auVar195._0_4_ = auVar237._0_4_ * fVar199;
                  auVar195._4_4_ = auVar237._4_4_ * fVar199;
                  auVar195._8_4_ = auVar237._8_4_ * fVar199;
                  auVar195._12_4_ = auVar237._12_4_ * fVar199;
                  auVar76 = vfmadd213ps_fma(auVar73,auVar195,auVar70);
                  auVar71 = vshufps_avx(auVar195,auVar195,0xc9);
                  auVar69 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar196._0_4_ = auVar195._0_4_ * auVar69._0_4_;
                  auVar196._4_4_ = auVar195._4_4_ * auVar69._4_4_;
                  auVar196._8_4_ = auVar195._8_4_ * auVar69._8_4_;
                  auVar196._12_4_ = auVar195._12_4_ * auVar69._12_4_;
                  auVar70 = vfmsub231ps_fma(auVar196,auVar70,auVar71);
                  auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                  auVar69 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                  auVar136._0_4_ = auVar76._0_4_ * auVar70._0_4_;
                  auVar136._4_4_ = auVar76._4_4_ * auVar70._4_4_;
                  auVar136._8_4_ = auVar76._8_4_ * auVar70._8_4_;
                  auVar136._12_4_ = auVar76._12_4_ * auVar70._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar136,auVar71,auVar69);
                  auVar71 = vshufps_avx(auVar69,auVar69,0xe9);
                  local_640 = vmovlps_avx(auVar71);
                  local_638 = auVar69._0_4_;
                  local_630 = 0;
                  local_62c = (undefined4)local_8d0;
                  local_628 = (undefined4)local_8c8;
                  local_624 = context->user->instID[0];
                  local_620 = context->user->instPrimID[0];
                  ray->tfar = fVar205;
                  local_904 = -1;
                  local_6b0.valid = &local_904;
                  local_6b0.geometryUserPtr = pGVar3->userPtr;
                  local_6b0.context = context->user;
                  local_6b0.hit = (RTCHitN *)&local_640;
                  local_6b0.N = 1;
                  local_900._0_8_ = pGVar3;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_634 = fVar178;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_017ec4e8:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_900._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar233 = ZEXT1664(auVar233._0_16_);
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      (*p_Var4)(&local_6b0);
                      auVar265 = ZEXT3264(local_7a0);
                      auVar264 = ZEXT3264(local_780);
                      auVar263 = ZEXT3264(local_760);
                      auVar261 = ZEXT3264(local_740);
                      auVar260 = ZEXT3264(local_8a0);
                      auVar258 = ZEXT3264(local_880);
                      auVar257 = ZEXT3264(local_860);
                      auVar256 = ZEXT3264(local_840);
                      auVar255 = ZEXT3264(local_820);
                      auVar254 = ZEXT3264(local_800);
                      auVar262 = ZEXT3264(local_720);
                      auVar259 = ZEXT3264(local_700);
                      if (*local_6b0.valid == 0) goto LAB_017ec58f;
                    }
                    bVar57 = 1;
                    goto LAB_017ec28c;
                  }
                  auVar233 = ZEXT1664(auVar230);
                  auVar240 = ZEXT1664(auVar239);
                  auVar247 = ZEXT1664(auVar237);
                  (*pGVar3->occlusionFilterN)(&local_6b0);
                  auVar265 = ZEXT3264(local_7a0);
                  auVar264 = ZEXT3264(local_780);
                  auVar263 = ZEXT3264(local_760);
                  auVar261 = ZEXT3264(local_740);
                  auVar260 = ZEXT3264(local_8a0);
                  auVar258 = ZEXT3264(local_880);
                  auVar257 = ZEXT3264(local_860);
                  auVar256 = ZEXT3264(local_840);
                  auVar255 = ZEXT3264(local_820);
                  auVar254 = ZEXT3264(local_800);
                  auVar262 = ZEXT3264(local_720);
                  auVar259 = ZEXT3264(local_700);
                  if (*local_6b0.valid != 0) goto LAB_017ec4e8;
LAB_017ec58f:
                  ray->tfar = (float)local_8c0._0_4_;
                }
                bVar57 = 0;
                goto LAB_017ec28c;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar64 = false;
LAB_017ec28c:
          bVar62 = bVar62 | bVar64 & bVar57;
          fVar178 = ray->tfar;
          auVar55._4_4_ = fStack_3bc;
          auVar55._0_4_ = local_3c0;
          auVar55._8_4_ = fStack_3b8;
          auVar55._12_4_ = fStack_3b4;
          auVar55._16_4_ = fStack_3b0;
          auVar55._20_4_ = fStack_3ac;
          auVar55._24_4_ = fStack_3a8;
          auVar55._28_4_ = fStack_3a4;
          fVar205 = ray->tfar;
          auVar36._4_4_ = fVar205;
          auVar36._0_4_ = fVar205;
          auVar36._8_4_ = fVar205;
          auVar36._12_4_ = fVar205;
          auVar36._16_4_ = fVar205;
          auVar36._20_4_ = fVar205;
          auVar36._24_4_ = fVar205;
          auVar36._28_4_ = fVar205;
          uVar14 = vcmpps_avx512vl(auVar55,auVar36,2);
        }
        uVar16 = vpcmpd_avx512vl(local_380,local_2e0,1);
        uVar15 = vpcmpd_avx512vl(local_380,_local_3e0,1);
        auVar176._0_4_ = (float)local_400._0_4_ + (float)local_320._0_4_;
        auVar176._4_4_ = (float)local_400._4_4_ + (float)local_320._4_4_;
        auVar176._8_4_ = fStack_3f8 + fStack_318;
        auVar176._12_4_ = fStack_3f4 + fStack_314;
        auVar176._16_4_ = fStack_3f0 + fStack_310;
        auVar176._20_4_ = fStack_3ec + fStack_30c;
        auVar176._24_4_ = fStack_3e8 + fStack_308;
        auVar176._28_4_ = fStack_3e4 + fStack_304;
        auVar198._4_4_ = fVar178;
        auVar198._0_4_ = fVar178;
        auVar198._8_4_ = fVar178;
        auVar198._12_4_ = fVar178;
        auVar198._16_4_ = fVar178;
        auVar198._20_4_ = fVar178;
        auVar198._24_4_ = fVar178;
        auVar198._28_4_ = fVar178;
        uVar14 = vcmpps_avx512vl(auVar176,auVar198,2);
        bVar59 = (byte)local_7a4 & (byte)uVar16 & (byte)uVar14;
        auVar177._0_4_ = (float)local_400._0_4_ + (float)local_360._0_4_;
        auVar177._4_4_ = (float)local_400._4_4_ + (float)local_360._4_4_;
        auVar177._8_4_ = fStack_3f8 + fStack_358;
        auVar177._12_4_ = fStack_3f4 + fStack_354;
        auVar177._16_4_ = fStack_3f0 + fStack_350;
        auVar177._20_4_ = fStack_3ec + fStack_34c;
        auVar177._24_4_ = fStack_3e8 + fStack_348;
        auVar177._28_4_ = fStack_3e4 + fStack_344;
        uVar14 = vcmpps_avx512vl(auVar177,auVar198,2);
        bVar56 = bVar56 & (byte)uVar15 & (byte)uVar14 | bVar59;
        prim = local_610;
        if (bVar56 != 0) {
          uVar63 = (ulong)uVar58;
          abStack_180[uVar63 * 0x60] = bVar56;
          bVar64 = (bool)(bVar59 >> 1 & 1);
          bVar5 = (bool)(bVar59 >> 2 & 1);
          bVar6 = (bool)(bVar59 >> 3 & 1);
          bVar7 = (bool)(bVar59 >> 4 & 1);
          bVar8 = (bool)(bVar59 >> 5 & 1);
          bVar9 = (bool)(bVar59 >> 6 & 1);
          auStack_160[uVar63 * 0x18] =
               (uint)(bVar59 & 1) * local_320._0_4_ | (uint)!(bool)(bVar59 & 1) * local_360._0_4_;
          auStack_160[uVar63 * 0x18 + 1] =
               (uint)bVar64 * local_320._4_4_ | (uint)!bVar64 * local_360._4_4_;
          auStack_160[uVar63 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_318 | (uint)!bVar5 * (int)fStack_358;
          auStack_160[uVar63 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_314 | (uint)!bVar6 * (int)fStack_354;
          auStack_160[uVar63 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_310 | (uint)!bVar7 * (int)fStack_350;
          auStack_160[uVar63 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_30c | (uint)!bVar8 * (int)fStack_34c;
          auStack_160[uVar63 * 0x18 + 6] =
               (uint)bVar9 * (int)fStack_308 | (uint)!bVar9 * (int)fStack_348;
          auStack_160[uVar63 * 0x18 + 7] =
               (uint)(bVar59 >> 7) * (int)fStack_304 | (uint)!(bool)(bVar59 >> 7) * (int)fStack_344;
          uVar65 = vmovlps_avx(local_390);
          (&uStack_140)[uVar63 * 0xc] = uVar65;
          aiStack_138[uVar63 * 0x18] = local_920 + 1;
          uVar58 = uVar58 + 1;
        }
      }
    }
    fVar178 = ray->tfar;
    fVar205 = ray->tfar;
    auVar155._4_4_ = fVar205;
    auVar155._0_4_ = fVar205;
    auVar155._8_4_ = fVar205;
    auVar155._12_4_ = fVar205;
    auVar155._16_4_ = fVar205;
    auVar155._20_4_ = fVar205;
    auVar155._24_4_ = fVar205;
    auVar155._28_4_ = fVar205;
    do {
      uVar66 = uVar58;
      uVar119 = uVar66 - 1;
      if (uVar66 == 0) {
        if (bVar62 != 0) goto LAB_017ec6ed;
        auVar137._4_4_ = fVar178;
        auVar137._0_4_ = fVar178;
        auVar137._8_4_ = fVar178;
        auVar137._12_4_ = fVar178;
        uVar14 = vcmpps_avx512vl(auVar137,local_3a0,0xd);
        local_608 = (ulong)((uint)local_4c8 & (uint)uVar14);
        goto LAB_017e9e9c;
      }
      uVar65 = (ulong)uVar119;
      auVar77 = *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x18);
      auVar197._0_4_ = auVar77._0_4_ + (float)local_400._0_4_;
      auVar197._4_4_ = auVar77._4_4_ + (float)local_400._4_4_;
      auVar197._8_4_ = auVar77._8_4_ + fStack_3f8;
      auVar197._12_4_ = auVar77._12_4_ + fStack_3f4;
      auVar197._16_4_ = auVar77._16_4_ + fStack_3f0;
      auVar197._20_4_ = auVar77._20_4_ + fStack_3ec;
      auVar197._24_4_ = auVar77._24_4_ + fStack_3e8;
      auVar197._28_4_ = auVar77._28_4_ + fStack_3e4;
      uVar14 = vcmpps_avx512vl(auVar197,auVar155,2);
      uVar120 = (uint)uVar14 & (uint)abStack_180[uVar65 * 0x60];
      uVar58 = uVar119;
    } while (uVar120 == 0);
    uVar63 = (&uStack_140)[uVar65 * 0xc];
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar63;
    auVar156._8_4_ = 0x7f800000;
    auVar156._0_8_ = 0x7f8000007f800000;
    auVar156._12_4_ = 0x7f800000;
    auVar156._16_4_ = 0x7f800000;
    auVar156._20_4_ = 0x7f800000;
    auVar156._24_4_ = 0x7f800000;
    auVar156._28_4_ = 0x7f800000;
    auVar77 = vblendmps_avx512vl(auVar156,auVar77);
    bVar56 = (byte)uVar120;
    auVar114._0_4_ = (uint)(bVar56 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar56 & 1) * 0x7f800000;
    bVar64 = (bool)((byte)(uVar120 >> 1) & 1);
    auVar114._4_4_ = (uint)bVar64 * auVar77._4_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar120 >> 2) & 1);
    auVar114._8_4_ = (uint)bVar64 * auVar77._8_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar120 >> 3) & 1);
    auVar114._12_4_ = (uint)bVar64 * auVar77._12_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar120 >> 4) & 1);
    auVar114._16_4_ = (uint)bVar64 * auVar77._16_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar120 >> 5) & 1);
    auVar114._20_4_ = (uint)bVar64 * auVar77._20_4_ | (uint)!bVar64 * 0x7f800000;
    bVar64 = (bool)((byte)(uVar120 >> 6) & 1);
    auVar114._24_4_ = (uint)bVar64 * auVar77._24_4_ | (uint)!bVar64 * 0x7f800000;
    auVar114._28_4_ = (uVar120 >> 7) * auVar77._28_4_ | (uint)!SUB41(uVar120 >> 7,0) * 0x7f800000;
    auVar77 = vshufps_avx(auVar114,auVar114,0xb1);
    auVar77 = vminps_avx(auVar114,auVar77);
    auVar80 = vshufpd_avx(auVar77,auVar77,5);
    auVar77 = vminps_avx(auVar77,auVar80);
    auVar80 = vpermpd_avx2(auVar77,0x4e);
    auVar77 = vminps_avx(auVar77,auVar80);
    uVar14 = vcmpps_avx512vl(auVar114,auVar77,0);
    bVar59 = (byte)uVar14 & bVar56;
    if (bVar59 != 0) {
      uVar120 = (uint)bVar59;
    }
    uVar121 = 0;
    for (; (uVar120 & 1) == 0; uVar120 = uVar120 >> 1 | 0x80000000) {
      uVar121 = uVar121 + 1;
    }
    local_920 = aiStack_138[uVar65 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar121 & 0x1f)) & bVar56;
    abStack_180[uVar65 * 0x60] = bVar56;
    uVar58 = uVar66;
    if (bVar56 == 0) {
      uVar58 = uVar119;
    }
    uVar126 = (undefined4)uVar63;
    auVar157._4_4_ = uVar126;
    auVar157._0_4_ = uVar126;
    auVar157._8_4_ = uVar126;
    auVar157._12_4_ = uVar126;
    auVar157._16_4_ = uVar126;
    auVar157._20_4_ = uVar126;
    auVar157._24_4_ = uVar126;
    auVar157._28_4_ = uVar126;
    auVar71 = vmovshdup_avx(auVar130);
    auVar71 = vsubps_avx(auVar71,auVar130);
    auVar139._0_4_ = auVar71._0_4_;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    auVar139._16_4_ = auVar139._0_4_;
    auVar139._20_4_ = auVar139._0_4_;
    auVar139._24_4_ = auVar139._0_4_;
    auVar139._28_4_ = auVar139._0_4_;
    auVar71 = vfmadd132ps_fma(auVar139,auVar157,_DAT_01f7b040);
    _local_320 = ZEXT1632(auVar71);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_320 + (ulong)uVar121 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }